

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver3L1Q_New<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,
            vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *plPair,
            vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   *lCPair)

{
  pointer src;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  undefined1 auVar64 [12];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  uint uVar67;
  Scalar *pSVar68;
  ulong uVar69;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *pCVar70;
  ostream *poVar71;
  long lVar72;
  long lVar73;
  ulong uVar74;
  pointer pMVar75;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar76;
  byte bVar77;
  RealScalar RVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  double dVar112;
  double dVar113;
  double dVar118;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  double dVar119;
  undefined1 auVar117 [16];
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  undefined1 auVar140 [16];
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  undefined1 auVar141 [16];
  undefined4 uVar150;
  undefined4 uVar151;
  undefined4 uVar152;
  undefined4 uVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar178;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  undefined4 uVar188;
  undefined4 uVar189;
  undefined4 uVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar196;
  undefined1 auVar195 [16];
  double dVar197;
  double dVar198;
  undefined1 local_1518 [16];
  undefined1 local_1508 [12];
  undefined4 uStack_14fc;
  undefined4 uStack_14f4;
  undefined8 uStack_14f0;
  undefined1 local_14e8 [20];
  undefined4 uStack_14d4;
  undefined4 uStack_14d0;
  undefined4 uStack_14cc;
  undefined1 local_14c8 [12];
  undefined4 uStack_14bc;
  double local_14b8;
  undefined4 uStack_14a4;
  double dStack_14a0;
  undefined1 local_1498 [12];
  undefined4 uStack_148c;
  undefined1 local_1488 [20];
  undefined4 uStack_1474;
  undefined8 uStack_1470;
  undefined1 local_1458 [36];
  undefined4 uStack_1434;
  double dStack_1430;
  undefined4 uStack_1424;
  undefined4 uStack_1420;
  undefined4 uStack_141c;
  undefined4 uStack_1414;
  undefined4 uStack_1410;
  undefined4 uStack_140c;
  double dStack_1400;
  double dStack_13e0;
  double dStack_13d0;
  double local_13b8;
  double dStack_13a0;
  double dStack_1390;
  double dStack_1370;
  double dStack_1350;
  double dStack_1340;
  undefined4 uStack_1324;
  undefined8 uStack_1320;
  double dStack_1310;
  double dStack_12d0;
  undefined4 uStack_12a4;
  undefined4 uStack_12a0;
  undefined4 uStack_129c;
  undefined8 uStack_1290;
  double dStack_1270;
  uint uStack_1264;
  undefined4 uStack_1260;
  undefined4 uStack_1244;
  double dStack_1240;
  undefined4 uStack_1224;
  undefined4 uStack_1220;
  undefined4 uStack_121c;
  double dStack_1210;
  double dStack_1200;
  double dStack_11f0;
  double dStack_11e0;
  double dStack_11c0;
  undefined4 uStack_1174;
  double dStack_1170;
  double dStack_1150;
  undefined8 local_1148;
  undefined4 uStack_1124;
  undefined4 uStack_1120;
  undefined4 uStack_111c;
  double dStack_1110;
  double dStack_10c0;
  vector<double,_std::allocator<double>_> calc_realRoots;
  double dStack_fa0;
  double dStack_f80;
  double dStack_f20;
  double local_f10;
  double local_f08;
  double local_f00;
  double local_ef8;
  double local_ef0;
  double local_ee8;
  double local_ee0;
  double local_ed8;
  double local_ed0;
  Matrix<double,_6,_6,_0,_6,_6> transLineU;
  Matrix<double,_6,_1,_0,_6,_1> M1_1;
  _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_d70;
  Matrix<double,_6,_1,_0,_6,_1> L3_1;
  Matrix<double,_6,_1,_0,_6,_1> L2_1;
  Matrix<double,_6,_6,_0,_6,_6> transLineV;
  Matrix<double,_3,_1,_0,_3,_1> D3;
  Matrix<double,_3,_1,_0,_3,_1> D2;
  Matrix<double,_3,_1,_0,_3,_1> D1;
  Matrix<double,_3,_1,_0,_3,_1> tQ32;
  Matrix<double,_3,_1,_0,_3,_1> tQ31;
  Matrix<double,_3,_1,_0,_3,_1> tQ22;
  Matrix<double,_3,_1,_0,_3,_1> tQ21;
  Matrix<double,_3,_1,_0,_3,_1> tQ12;
  Matrix<double,_3,_1,_0,_3,_1> tQ11;
  Matrix<double,_6,_1,_0,_6,_1> L1_1;
  double dStack_a30;
  double dStack_9e0;
  double dStack_9a0;
  double dStack_8b0;
  double dStack_860;
  Matrix<double,_6,_1,_0,_6,_1> M3_1;
  Matrix<double,_6,_1,_0,_6,_1> M2_1;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> local_788;
  Matrix<double,_3,_1,_0,_3,_1> tP32;
  Matrix<double,_3,_1,_0,_3,_1> tP31;
  Matrix<double,_3,_1,_0,_3,_1> tP22;
  Matrix<double,_3,_1,_0,_3,_1> tP21;
  Matrix<double,_3,_1,_0,_3,_1> tP12;
  Matrix<double,_3,_1,_0,_3,_1> tP11;
  Matrix<double,_6,_1,_0,_6,_1> L3;
  Matrix<double,_6,_1,_0,_6,_1> L2;
  Matrix<double,_4,_4,_0,_4,_4> TP;
  Matrix<double,_9,_1,_0,_9,_1> coeff;
  Matrix<double,_4,_1,_0,_4,_1> R32_B;
  Matrix<double,_4,_1,_0,_4,_1> R31_B;
  Matrix<double,_4,_1,_0,_4,_1> Q32;
  Matrix<double,_4,_1,_0,_4,_1> Q31;
  Matrix<double,_4,_1,_0,_4,_1> R22_B;
  Matrix<double,_4,_1,_0,_4,_1> R21_B;
  Matrix<double,_4,_1,_0,_4,_1> Q22;
  Matrix<double,_4,_1,_0,_4,_1> Q21;
  Matrix<double,_4,_1,_0,_4,_1> R12_B;
  Matrix<double,_4,_1,_0,_4,_1> R11_B;
  Matrix<double,_4,_1,_0,_4,_1> Q12;
  Matrix<double,_4,_1,_0,_4,_1> P1_B;
  Matrix<double,_4,_1,_0,_4,_1> P1;
  PolynomialSolver<double,__1> solver;
  Matrix<double,_6,_1,_0,_6,_1> M3;
  Matrix<double,_6,_1,_0,_6,_1> M2;
  Matrix<double,_6,_1,_0,_6,_1> M1;
  Matrix<double,_6,_1,_0,_6,_1> L1;
  Matrix<double,_3,_1,_0,_3,_1> local_248;
  Matrix<double,_3,_1,_0,_3,_1> local_230;
  Matrix<double,_4,_1,_0,_4,_1> Q11;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  Matrix<double,_4,_4,_0,_4,_4> outi;
  Matrix<double,_4,_1,_0,_4,_1> local_78;
  Matrix<double,_4,_1,_0,_4,_1> local_58;
  
  bVar77 = 0;
  src = (ptPair->
        super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (((ptPair->
       super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish != src) &&
     (0x100 < (ulong)((long)(lPair->
                            super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(lPair->
                           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start))) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P1,&src->first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P1_B,&((ptPair->
                       super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q11,(Matrix<double,_4,_1,_0,_4,_1> *)
                    (lPair->
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q12,&(((lPair->
                       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->first).second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&R11_B,&(((lPair->
                         super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->second).first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&R12_B,&(((lPair->
                         super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->second).second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q21,(Matrix<double,_4,_1,_0,_4,_1> *)
                    ((lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1));
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q22,&(lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[1].first.second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&R21_B,&(lPair->
                       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1].second.first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&R22_B,&(lPair->
                       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1].second.second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q31,(Matrix<double,_4,_1,_0,_4,_1> *)
                    ((lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 2));
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q32,&(lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[2].first.second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&R31_B,&(lPair->
                       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[2].second.first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&R32_B,&(lPair->
                       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[2].second.second);
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q11,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP11,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q12,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP12,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&R11_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               R11_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ11,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&R12_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               R12_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ12,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q21,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP21,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q22,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP22,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&R21_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               R21_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ21,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&R22_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               R22_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ22,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q31,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP31,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q32,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP32,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&R31_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               R31_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ31,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&R32_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               R32_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ32,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&transLineU);
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = (double)&tP12;
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = (double)&tP11;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&D1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D1);
    dVar156 = tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [2] = tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._0_4_ = SUB84(dVar156,0);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._4_4_ = (int)((ulong)dVar156 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<double,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L1,3);
    RVar78 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
             norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                  &transLineU);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = RVar78;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L1,(Scalar *)&transLineV);
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = (double)&tP22;
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = (double)&tP21;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&D2,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D2);
    dVar156 = tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [2] = tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._0_4_ = SUB84(dVar156,0);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._4_4_ = (int)((ulong)dVar156 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<double,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L2,3);
    RVar78 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
             norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                  &transLineU);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = RVar78;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L2,(Scalar *)&transLineV);
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = (double)&tP32;
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = (double)&tP31;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&D3,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D3);
    dVar156 = tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [2] = tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._0_4_ = SUB84(dVar156,0);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._4_4_ = (int)((ulong)dVar156 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<double,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L3,3);
    RVar78 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
             norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                  &transLineU);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = RVar78;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L3,(Scalar *)&transLineV);
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = (double)&tQ12;
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = (double)&tQ11;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D1);
    dVar156 = tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [2] = tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._0_4_ = SUB84(dVar156,0);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._4_4_ = (int)((ulong)dVar156 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<double,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M1,3);
    RVar78 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
             norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                  &transLineU);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = RVar78;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M1,(Scalar *)&transLineV);
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = (double)&tQ22;
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = (double)&tQ21;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D2,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D2);
    dVar156 = tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [2] = tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._0_4_ = SUB84(dVar156,0);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._4_4_ = (int)((ulong)dVar156 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<double,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M2,3);
    RVar78 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
             norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                  &transLineU);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = RVar78;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M2,(Scalar *)&transLineV);
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = (double)&tQ32;
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = (double)&tQ31;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D3,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D3);
    dVar156 = tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [2] = tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] * tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._0_4_ = SUB84(dVar156,0);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1] -
          tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] * tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1]._4_4_ = (int)((ulong)dVar156 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<double,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M3,3);
    RVar78 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
             norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                  &transLineU);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = RVar78;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&M3,(Scalar *)&transLineV);
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
    ;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
    ;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
    ;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
    ;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [0];
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [1];
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [2];
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [3];
    getPredefinedTransformations3L1Q<double>
              ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&local_d70,&local_58,&local_78);
    lVar73 = 0x10;
    pMVar75 = local_d70._M_impl.super__Vector_impl_data._M_finish + -1;
    pMVar76 = &TV;
    for (lVar72 = lVar73; lVar72 != 0; lVar72 = lVar72 + -1) {
      (pMVar76->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (pMVar75->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
            .array[0];
      pMVar75 = (pointer)((long)pMVar75 + ((ulong)bVar77 * -2 + 1) * 8);
      pMVar76 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar76 + ((ulong)bVar77 * -2 + 1) * 8);
    }
    local_d70._M_impl.super__Vector_impl_data._M_finish =
         local_d70._M_impl.super__Vector_impl_data._M_finish + -2;
    pMVar75 = local_d70._M_impl.super__Vector_impl_data._M_finish;
    pMVar76 = &TU;
    for (; lVar73 != 0; lVar73 = lVar73 + -1) {
      (pMVar76->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (pMVar75->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
            .array[0];
      pMVar75 = (pointer)((long)pMVar75 + ((ulong)bVar77 * -2 + 1) * 8);
      pMVar76 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar76 + ((ulong)bVar77 * -2 + 1) * 8);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&solver,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TP,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TP,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&solver);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&solver,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&TP,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TP,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&solver);
    M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0].
    _0_4_ = 0xffffffff;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)&L2_1
                    ,&TU,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&TP,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)&L2_1,3
              );
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_230,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&TP);
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&outi,&local_230);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      *)&L3_1,(int *)&M1_1,(StorageBaseType *)&outi);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&coeff,&TU,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&solver,(Lhs *)&L3_1,(Rhs *)&coeff);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&L1_1,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&L1_1,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&solver);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&solver,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TP,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TP,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&solver);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&solver,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&TP,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TP,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&solver);
    M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0].
    _0_4_ = 0xffffffff;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)&L2_1
                    ,&TV,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&TP,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)&L2_1,3
              );
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_248,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&TP);
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&outi,&local_248);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      *)&L3_1,(int *)&M1_1,(StorageBaseType *)&outi);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&coeff,&TV,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&solver,(Lhs *)&L3_1,(Rhs *)&coeff);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&L1_1,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&L1_1,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&solver);
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (complex<double> *)&transLineU;
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)&L1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&L1_1,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&solver);
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)&L2;
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (complex<double> *)&transLineU;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&L2_1,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&solver);
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)&L3;
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (complex<double> *)&transLineU;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&L3_1,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&solver);
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (complex<double> *)&transLineV;
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)&M1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&M1_1,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&solver);
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (complex<double> *)&transLineV;
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)&M2;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&M2_1,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&solver);
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (complex<double> *)&transLineV;
    solver.super_PolynomialSolverBase<double,__1>.m_roots.
    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)&M3;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&M3_1,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&solver);
    dVar79 = L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[5] +
             L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[5];
    dVar87 = (double)CONCAT44(M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0]._4_4_,
                              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0]._0_4_);
    dVar80 = L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[3] +
             L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[3];
    dVar107 = L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] +
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4];
    dVar123 = L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0];
    dVar142 = L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1];
    dVar173 = (L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2]) *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4];
    dVar124 = L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3];
    dVar143 = L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4];
    dVar125 = L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5];
    dVar126 = dVar143 * dVar87 +
              dVar124 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] +
              dVar123 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] +
              dVar142 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    dVar144 = -dVar125 *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              dVar143 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
              dVar142 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] + -dVar173;
    dVar127 = (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] +
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2]) *
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3];
    dVar179 = M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4];
    dVar182 = M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5];
    auVar114._8_4_ =
         M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
         ._0_4_;
    auVar114._0_8_ = dVar182;
    auVar114._12_4_ =
         M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
         ._4_4_;
    dVar81 = L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[0] +
             L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[0];
    dVar108 = L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1];
    auVar46._8_4_ =
         SUB84(L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5],0);
    auVar46._0_8_ = dVar125;
    auVar46._12_4_ =
         (int)((ulong)L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[5] >> 0x20);
    dVar112 = L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] +
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5];
    dVar113 = dVar112 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] +
              dVar80 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] + dVar81 * dVar182 + dVar127;
    dVar128 = M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] *
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1];
    dVar145 = dVar179 * L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar166 = L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3];
    dVar185 = (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] +
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2]) * dVar179;
    dVar88 = dVar107 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] +
             dVar80 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1] +
             dVar81 * dVar179 +
             dVar108 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[3];
    dVar156 = -dVar112 *
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              dVar107 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] + dVar108 * dVar182 + -dVar185;
    auVar19._8_4_ = SUB84(dVar156,0);
    auVar19._0_8_ = dVar88;
    auVar19._12_4_ = (int)((ulong)dVar156 >> 0x20);
    dVar154 = L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] + dVar166 + dVar128 +
              dVar87 * L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[3];
    dVar161 = dVar112 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] +
              dVar107 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] + dVar185 + dVar182 * dVar108;
    dVar155 = (L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2]) *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3];
    dVar139 = (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] *
               -L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3] * dVar87 +
              dVar166 + -dVar128 +
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] *
              -L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2]) -
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2];
    dVar156 = L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] *
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3];
    dStack_14a0 = auVar114._8_8_;
    local_1518._8_8_ = auVar46._8_8_;
    dVar82 = dVar125 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[1] +
             dVar143 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] +
             dVar173 + M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[5] * dVar142;
    dVar109 = (double)local_1518._8_8_ *
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] +
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] *
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] * dVar182 + dVar145 + dVar156 +
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] *
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3];
    dVar86 = (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] * dVar182 + (-dVar145 - dVar156)) -
             L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[3] *
             M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[0];
    dVar156 = (-L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] * dStack_14a0 + (dVar145 - dVar156)) -
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3] *
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0];
    auVar47._8_4_ = SUB84(dVar156,0);
    auVar47._0_8_ = dVar86;
    auVar47._12_4_ = (int)((ulong)dVar156 >> 0x20);
    dVar83 = M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[2] *
             L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[5] +
             ((dVar87 * -L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array[3] +
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] *
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] +
              (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3] *
               -L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] - dVar128)) -
             M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[1] *
             L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[4]);
    dVar110 = M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] *
              -L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5] +
              ((M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] *
                L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] +
               dVar182 * -L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array[2] +
               (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] *
                L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] - dVar145)) -
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] *
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4]);
    dVar84 = (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] +
             L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[2]) *
             M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[3];
    dVar156 = L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] +
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0];
    dVar145 = L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1];
    dVar173 = L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4];
    dVar180 = L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3] +
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3];
    dVar183 = L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] +
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4];
    dVar129 = dVar79 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] +
              ((L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * -2.0 *
                M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5] + dVar84) -
              dVar180 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2]);
    dVar185 = (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] +
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2]) *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4];
    dVar85 = dVar79 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1] +
             dVar183 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] +
             dVar145 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[5] + dVar185;
    dVar181 = dVar183 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] +
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] * dVar180 +
              dVar156 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] +
              dVar145 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    dVar184 = -dVar79 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] +
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] * dVar183 +
              dVar145 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] + -dVar185;
    dVar50 = L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[0] *
             M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[3] + dVar173 +
             L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[2] *
             M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[5] +
             L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[3] *
             M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[0] +
             L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[4] *
             M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[1] +
             L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[5] *
             M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[2];
    dVar185 = (((L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] - dVar173) +
                M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5] *
                -L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2] +
               L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3] *
               M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0]) -
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1]) -
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2];
    local_1458._8_8_ = auVar19._8_8_;
    dVar111 = dVar82 * (double)local_1458._8_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::resize
              (&coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,9);
    dVar174 = M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] *
              -L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              (dVar128 - dVar166) +
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] *
              -L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] +
              dVar87 * -L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    dVar178 = dVar87 * dVar125 +
              dVar124 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
              dVar155 + M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * dVar123;
    dStack_1350 = auVar47._8_8_;
    dVar191 = M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] *
              -L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4] + dVar86 +
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] *
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5];
    dVar196 = M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] *
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] + dStack_1350 +
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] *
              -L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5];
    dVar166 = -dVar183 *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] +
              dVar180 * M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] +
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] * dVar156 +
              -(dVar145 *
               M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3]);
    dVar118 = L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] +
              -L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4] *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] *
              -L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3] +
              (-L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] *
               M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3] - dVar173) +
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5];
    dVar86 = M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[0] * dVar79 +
             M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[2] *
             (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3] +
             L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[3]) +
             M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[5] * dVar156 + dVar84;
    dVar128 = M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] *
              -L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5] +
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] *
              L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] +
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] *
              -L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3] +
              -L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0] *
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3] + dVar173 +
              M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] *
              -L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2];
    dVar84 = dVar196 * dVar83;
    dVar183 = -dVar82 * dVar196;
    dVar130 = dVar174 * dVar161;
    dVar79 = dVar82 * dVar196;
    dVar180 = dVar174 * dVar88;
    auVar116._8_4_ = SUB84(dVar180,0);
    auVar116._0_8_ = -dVar79;
    auVar116._12_4_ = (int)((ulong)dVar180 >> 0x20);
    dVar123 = dVar87 * -dVar143 +
              dVar124 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] +
              dVar123 * M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] +
              -(dVar142 *
               M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3]);
    dVar124 = dVar87 * dVar125 +
              -dVar124 *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] +
              L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] * -2.0 *
              M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] + dVar155;
    dVar108 = -dVar107 *
              M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] +
              dVar80 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[1] +
              dVar81 * dVar179 +
              -(dVar108 *
               M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3]);
    dVar112 = dVar112 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] +
              -dVar80 * M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
              L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] * -2.0 * dVar182 + dVar127;
    dVar156 = dVar110 * dVar82;
    auVar176._8_4_ = SUB84(dVar113 * dVar82,0);
    auVar176._0_8_ = dVar156;
    auVar176._12_4_ = (int)((ulong)(dVar113 * dVar82) >> 0x20);
    auVar195._8_4_ = SUB84(dVar79,0);
    auVar195._0_8_ = -dVar156;
    auVar195._12_4_ = (int)((ulong)dVar79 >> 0x20);
    local_1488._8_8_ =
         dVar129 * dVar130 +
         (((dVar82 * dVar112 * dVar128 + (dVar124 * dVar196 * dVar85 - dVar161 * dVar124 * dVar128))
          - dVar79 * dVar129) - dVar112 * dVar174 * dVar85);
    local_1488._0_8_ =
         dVar166 * dVar130 +
         (((dVar82 * dVar108 * dVar128 + (dVar123 * dVar196 * dVar85 - dVar161 * dVar123 * dVar128))
          - dVar79 * dVar166) - dVar108 * dVar174 * dVar85);
    dVar87 = (double)local_1458._8_8_ * dVar174;
    dVar145 = dVar144 * dVar196;
    auVar20._8_4_ = SUB84(dVar145,0);
    auVar20._0_8_ = dVar126 * dVar191;
    auVar20._12_4_ = (int)((ulong)dVar145 >> 0x20);
    auVar1._8_4_ = SUB84(dVar128,0);
    auVar1._0_8_ = dVar118;
    auVar1._12_4_ = (int)((ulong)dVar128 >> 0x20);
    dVar107 = dVar174 * dVar191;
    dVar125 = -dVar107;
    stack0xffffffffffffeb40 =
         (dVar191 * dVar178 * dVar128 +
         dVar113 * dVar174 * dVar118 +
         dVar125 * dVar86 + (dVar84 * dVar86 - dVar83 * dVar113 * dVar128)) -
         dVar178 * dVar196 * dVar118;
    local_14c8._0_8_ =
         (dVar108 * dVar174 * dVar118 +
         dVar84 * dVar166 +
         -(dVar83 * dVar108) * dVar128 + (dVar123 * dVar191 * dVar128 - dVar123 * dVar196 * dVar118)
         ) - dVar107 * dVar166;
    stack0xffffffffffffeb70 = auVar20._8_8_;
    stack0xffffffffffffeb70 =
         -stack0xffffffffffffeb70 * dVar118 +
         dVar128 * dVar191 * dVar144 +
         dVar87 * dVar118 +
         dVar125 * dVar184 + dVar84 * dVar184 + -(dVar83 * (double)local_1458._8_8_) * dVar128;
    local_1498._0_8_ =
         dVar112 * dVar174 * dVar118 +
         dVar129 * dVar125 +
         -(dVar124 * dVar196) * dVar118 +
         dVar124 * dVar191 * dVar128 + dVar112 * -dVar83 * dVar128 + dVar129 * dVar84;
    dStack_1370 = auVar116._8_8_;
    dStack_12d0 = auVar1._8_8_;
    dVar81 = -dVar83 * dVar161;
    dVar80 = dVar83 * dVar161;
    dVar173 = dVar82 * dVar191;
    local_14e8._8_8_ =
         dVar144 * dVar161 * dVar118 +
         (((dVar173 * dVar184 + dVar81 * dVar184 + dVar83 * (double)local_1458._8_8_ * dVar85) -
          dVar111 * dVar118) - dVar191 * dVar144 * dVar85);
    local_14e8._0_8_ =
         dVar126 * dVar161 * dVar118 +
         (((dVar173 * dVar181 + dVar81 * dVar181 + dVar83 * dVar88 * dVar85) -
          dVar82 * dVar88 * dVar118) - dVar191 * dVar126 * dVar85);
    uStack_1470 = auVar195._8_8_;
    dStack_1200 = auVar176._8_8_;
    stack0xffffffffffffeb00 =
         dVar178 * dVar196 * dVar85 +
         (((dVar86 * dVar130 + dVar183 * dVar86 + dStack_1200 * dVar128) -
          dVar113 * dVar174 * dVar85) - dVar178 * dVar161 * dVar128);
    local_1508._0_8_ =
         dVar196 * dVar139 * dVar85 +
         (((dVar185 * dVar130 + dVar183 * dVar185 + dVar156 * dVar128) - dVar110 * dVar174 * dVar85)
         - dVar139 * dVar161 * dVar128);
    local_1458._8_8_ =
         dVar173 * dVar50 +
         dVar118 * -(dVar109 * dVar82) +
         -dVar80 * dVar50 +
         dVar83 * dVar109 * dVar85 + -dVar154 * dVar191 * dVar85 + dVar118 * dVar154 * dVar161;
    local_1458._0_8_ =
         -(dVar82 * dVar112) * dVar118 +
         dVar129 * dVar173 +
         dVar124 * dVar161 * dVar118 +
         -(dVar124 * dVar191) * dVar85 + dVar112 * dVar83 * dVar85 + -dVar80 * dVar129;
    auVar140._8_8_ =
         -(dVar196 * dVar139) * dVar118 +
         dVar191 * dVar139 * dStack_12d0 +
         dVar110 * dVar174 * dVar118 +
         dVar125 * dVar185 + (dVar84 * dVar185 - dStack_12d0 * dVar110 * dVar83);
    auVar140._0_8_ =
         dVar50 * dVar125 +
         dVar109 * dVar174 * dVar118 +
         dVar50 * dVar84 +
         dVar128 * -(dVar83 * dVar109) + (dVar128 * dVar154 * dVar191 - dVar118 * dVar196 * dVar154)
    ;
    local_1518._8_8_ =
         -dVar130 * dVar118 +
         dVar107 * dVar85 +
         uStack_1470 * dVar118 + -dVar173 * dVar128 + dVar80 * dVar128 + -dVar84 * dVar85;
    auVar33._8_8_ = local_1518._8_8_;
    auVar33._0_8_ = local_1518._8_8_;
    auVar195 = divpd(_local_14c8,auVar33);
    auVar34._8_8_ = local_1518._8_8_;
    auVar34._0_8_ = local_1518._8_8_;
    auVar176 = divpd(_local_1498,auVar34);
    auVar35._8_8_ = local_1518._8_8_;
    auVar35._0_8_ = local_1518._8_8_;
    auVar114 = divpd(local_1488._0_16_,auVar35);
    dVar124 = auVar114._0_8_;
    dVar179 = auVar114._8_8_;
    dVar192 = auVar195._0_8_;
    dVar197 = auVar195._8_8_;
    dVar170 = auVar176._0_8_;
    dVar182 = dVar170 * 2.0;
    auVar115._8_8_ =
         -(dVar126 * dVar196) * dVar118 +
         dVar191 * dVar126 * dVar128 +
         dStack_1370 * dVar118 + dVar125 * dVar181 + dVar84 * dVar181 + dVar128 * -(dVar83 * dVar88)
    ;
    auVar115._0_8_ =
         dVar130 * dVar50 +
         -(dVar109 * dVar174) * dVar85 +
         -dVar79 * dVar50 +
         dVar109 * dVar82 * dVar128 + dVar161 * -dVar154 * dVar128 + dVar196 * dVar154 * dVar85;
    auVar36._8_8_ = local_1518._8_8_;
    auVar36._0_8_ = local_1518._8_8_;
    auVar116 = divpd(auVar115,auVar36);
    dVar174 = auVar116._8_8_;
    dVar125 = dVar192 + dVar192;
    dVar119 = dVar174 + dVar174;
    dVar79 = dVar182 * dVar192;
    auVar21._8_4_ = SUB84(dVar119 * dVar174,0);
    auVar21._0_8_ = dVar79;
    auVar21._12_4_ = (int)((ulong)(dVar119 * dVar174) >> 0x20);
    dVar84 = (dVar126 * dVar196 * dVar85 +
             (((dVar130 * dVar181 + dVar183 * dVar181 + dVar82 * dVar88 * dVar128) -
              dVar180 * dVar85) - dVar126 * dVar161 * dVar128)) / (double)local_1518._8_8_;
    dVar126 = (dVar173 * dVar166 +
              (((dVar83 * dVar108 * dVar85 +
                -dVar123 * dVar191 * dVar85 + dVar123 * dVar161 * dVar118) - dVar80 * dVar166) -
              dVar82 * dVar108 * dVar118)) / (double)local_1518._8_8_;
    dVar175 = auVar176._8_8_;
    dVar88 = dVar170 * 4.0;
    auVar22._8_4_ = SUB84(dVar88,0);
    auVar22._0_8_ = dVar192;
    auVar22._12_4_ = (int)((ulong)dVar88 >> 0x20);
    auVar23._8_4_ = SUB84(dVar88 * dVar192,0);
    auVar23._0_8_ = dVar179;
    auVar23._12_4_ = (int)((ulong)(dVar88 * dVar192) >> 0x20);
    auVar37._8_8_ = local_1518._8_8_;
    auVar37._0_8_ = local_1518._8_8_;
    auVar114 = divpd(local_14e8._0_16_,auVar37);
    dVar108 = auVar114._0_8_;
    dVar180 = auVar114._8_8_;
    dVar167 = -dVar108;
    dVar171 = -dVar180;
    auVar38._8_8_ = local_1518._8_8_;
    auVar38._0_8_ = local_1518._8_8_;
    auVar176 = divpd(auVar140,auVar38);
    dVar109 = dVar197 + dVar197;
    dVar160 = auVar176._8_8_;
    dVar80 = (dVar178 * dVar161 * dVar118 +
             (((dVar173 * dVar86 + dVar81 * dVar86 + dVar83 * dVar113 * dVar85) -
              dStack_1200 * dVar118) - dVar191 * dVar178 * dVar85)) / (double)local_1518._8_8_;
    auVar39._8_8_ = local_1518._8_8_;
    auVar39._0_8_ = local_1518._8_8_;
    auVar114 = divpd(_local_1508,auVar39);
    dVar178 = auVar114._8_8_;
    dVar193 = dVar80 * dVar178;
    dVar127 = auVar114._0_8_;
    dVar194 = -dVar193;
    dVar198 = -dVar80;
    local_1518._0_8_ = local_1518._8_8_;
    dVar186 = (dVar139 * dVar161 * dVar118 +
              -(dVar191 * dVar139) * dVar85 +
              -dVar156 * dVar118 + dVar173 * dVar185 + dVar81 * dVar185 + dVar110 * dVar83 * dVar85)
              / (double)local_1518._8_8_;
    dVar131 = (dVar145 * dVar85 +
              (((dVar184 * dVar130 + dVar183 * dVar184 + dVar111 * dVar128) - dVar87 * dVar85) -
              dVar144 * dVar161 * dVar128)) / (double)local_1518._8_8_;
    dVar132 = dVar80 * dVar179;
    dVar86 = dVar170 * dVar192 - dVar179 * dVar126;
    auVar117._0_8_ = -dVar126;
    auVar114 = divpd(local_1458._0_16_,local_1518);
    dVar110 = dVar124 * dVar126;
    dVar149 = auVar114._0_8_;
    dVar165 = auVar114._8_8_;
    dVar111 = -dVar110;
    dVar183 = -dVar186;
    local_14b8 = auVar176._0_8_;
    dVar128 = dVar174 * dVar175 +
              dVar170 * dVar160 +
              dVar131 * dVar197 +
              (((dVar171 * dVar84 + dVar179 * dVar183) - dVar124 * dVar160) - dVar178 * dVar175) +
              dVar127 * dVar192;
    dVar157 = dVar179 * auVar117._0_8_;
    local_13b8 = auVar116._0_8_;
    dVar81 = -dVar149;
    dVar82 = -dVar165;
    dVar166 = -dVar192;
    uStack_1290._4_4_ = auVar195._12_4_ ^ 0x80000000;
    dVar129 = dVar166 * dVar192 + auVar117._0_8_ * dVar170 + dVar149 * dVar192 + dVar110 + dVar165;
    dVar161 = dVar119 * dVar192;
    dVar85 = dVar170 * dVar170 +
             (((dVar81 * dVar179 + dVar179 * dVar192) - dVar124 * dVar170) - local_13b8);
    dVar181 = dVar174 * dVar160 + dVar127 * dVar197 + (dVar183 * dVar84 - dVar160 * dVar178);
    dVar50 = dVar182 * dVar170;
    auVar2._8_4_ = SUB84(dVar50,0);
    auVar2._0_8_ = dVar165 * dVar170;
    auVar2._12_4_ = (int)((ulong)dVar50 >> 0x20);
    dVar156 = dVar81 * dVar149;
    auVar3._8_4_ = SUB84(dVar170 * dVar80,0);
    auVar3._0_8_ = dVar156;
    auVar3._12_4_ = (int)((ulong)(dVar170 * dVar80) >> 0x20);
    dStack_13a0 = auVar23._8_8_;
    dVar133 = (dVar82 * dVar170 + local_13b8 * dVar126 + dVar149 * local_14b8) -
              dVar192 * local_14b8;
    dVar146 = (dVar166 * dVar175 +
              dVar82 * dVar174 +
              dVar80 * local_13b8 + dVar126 * dVar131 + dVar149 * dVar175 + dVar108 * local_14b8 +
              dVar171 * dVar170) - dVar197 * local_14b8;
    auVar117._8_4_ = SUB84(auVar117._0_8_,0);
    auVar117._12_4_ = (int)((ulong)auVar117._0_8_ >> 0x20);
    dVar130 = auVar117._0_8_ * dVar84;
    dVar184 = auVar117._8_8_ * dVar178;
    dVar134 = dVar124 * dVar198;
    auVar177._8_4_ = auVar114._0_4_;
    auVar177._0_8_ = dVar81;
    auVar177._12_4_ = (int)((ulong)dVar81 >> 0x20);
    auVar24._8_4_ = SUB84(dVar171,0);
    auVar24._0_8_ = dVar82;
    auVar24._12_4_ = (int)((ulong)dVar171 >> 0x20);
    auVar89._8_4_ = SUB84(dVar167,0);
    auVar89._0_8_ = dVar167;
    auVar89._12_4_ = (int)((ulong)dVar167 >> 0x20);
    dVar83 = dVar81 * dVar124;
    auVar40._8_4_ = SUB84(dVar167 * dVar180,0);
    auVar40._0_8_ = dVar83;
    auVar40._12_4_ = (int)((ulong)(dVar167 * dVar180) >> 0x20);
    dVar187 = dVar178 * auVar177._8_8_;
    dVar162 = dVar186 * auVar177._8_8_;
    uStack_14f0 = auVar89._8_8_;
    dVar145 = dVar167 * dVar124;
    auVar4._8_4_ = SUB84(uStack_14f0 * dVar178,0);
    auVar4._0_8_ = dVar145;
    auVar4._12_4_ = (int)((ulong)(uStack_14f0 * dVar178) >> 0x20);
    dVar168 = dVar182 * dVar197;
    uStack_1320 = auVar40._8_8_;
    dVar135 = local_14b8 * dVar170 +
              local_13b8 * dVar192 + (dVar82 * dVar179 - local_14b8 * dVar124);
    dVar147 = -dVar125 * dVar197 +
              dVar198 * dVar170 +
              dVar80 * dVar124 +
              auVar117._0_8_ * dVar174 + dVar126 * dVar178 + dVar149 * dVar197 + dVar108 * dVar192 +
              dVar180;
    dVar113 = dVar182 * dVar174 +
              ((((dVar81 * dVar84 + dVar179 * dVar167 + dVar179 * dVar197 + dVar84 * dVar192) -
                dVar124 * dVar174) - dVar178 * dVar170) - dVar131);
    dVar88 = (dVar124 + dVar124) * dVar192;
    auVar5._8_4_ = SUB84(dVar88,0);
    auVar5._0_8_ = dVar157;
    auVar5._12_4_ = (int)((ulong)dVar88 >> 0x20);
    dVar88 = dVar174 * (dVar80 + dVar80) * dVar170;
    dVar173 = dVar84 * dVar108 * dVar167;
    auVar6._8_4_ = SUB84(dVar173,0);
    auVar6._0_8_ = dVar88;
    auVar6._12_4_ = (int)((ulong)dVar173 >> 0x20);
    dVar136 = (dVar126 * dVar179 - dVar170 * dVar192) - local_14b8;
    dVar173 = dVar86 + local_14b8;
    dVar137 = dVar173 * dVar136;
    dVar148 = dVar113 * dVar133;
    dVar118 = dVar198 * dVar84;
    uStack_14f0 = auVar4._8_8_;
    dVar185 = (local_13b8 + local_13b8) * dVar192 * dVar197;
    dVar139 = dVar131 * dVar197 * dVar197;
    auVar7._8_4_ = SUB84(dVar139,0);
    auVar7._0_8_ = dVar185;
    auVar7._12_4_ = (int)((ulong)dVar139 >> 0x20);
    auVar8._8_4_ = SUB84(dVar197 * dVar119,0);
    auVar8._0_8_ = dVar192 * dVar125;
    auVar8._12_4_ = (int)((ulong)(dVar197 * dVar119) >> 0x20);
    dStack_1240 = auVar21._8_8_;
    dVar139 = (((dVar126 * dVar84 + dVar132) - dVar170 * dVar197) - dVar192 * dVar174) - dVar175;
    auVar25._8_4_ = SUB84(dVar139,0);
    auVar25._0_8_ = dVar86 - local_14b8;
    auVar25._12_4_ = (int)((ulong)dVar139 >> 0x20);
    auVar9._8_4_ = SUB84(uStack_14f0 * dVar175,0);
    auVar9._0_8_ = dVar145 * local_14b8;
    auVar9._12_4_ = (int)((ulong)(uStack_14f0 * dVar175) >> 0x20);
    auVar41._8_4_ = SUB84(dVar119 * dVar175,0);
    auVar41._0_8_ = dVar125 * local_14b8;
    auVar41._12_4_ = (int)((ulong)(dVar119 * dVar175) >> 0x20);
    dVar86 = (auVar117._0_8_ * dVar84 - dVar132) + dVar170 * dVar197 + dVar174 * dVar192 + dVar175;
    dVar123 = dVar174 * dVar197 + dVar198 * dVar84 + dVar160;
    dStack_11f0 = auVar22._8_8_;
    dVar139 = (dVar80 * dVar84 - dVar174 * dVar197) - dVar160;
    dVar87 = (dVar127 + dVar127) * dVar192;
    auVar10._8_4_ = SUB84(dVar87,0);
    auVar10._0_8_ = dVar131 * dVar192;
    auVar10._12_4_ = (int)((ulong)dVar87 >> 0x20);
    local_1148 = (double)CONCAT44((int)((ulong)dVar82 >> 0x20),auVar114._8_4_);
    dStack_f80 = auVar3._8_8_;
    dStack_a30 = auVar5._8_8_;
    dVar107 = dVar182 * local_14b8 +
              dVar179 * dVar192 * dVar192 +
              dVar170 * dVar157 +
              dVar157 * dVar124 +
              ((dVar156 * dVar179 + dVar170 * dVar83) - local_13b8 * dVar149) +
              dVar170 * dVar149 * dVar170 + dVar82 * dVar179 + dVar50 * dVar192;
    dVar50 = dVar109 * local_14b8 +
             dVar161 * dVar192 +
             dVar192 * dVar178 * dVar192 +
             dStack_a30 * dVar197 +
             ((dStack_f80 * dVar170 +
              dVar198 * local_13b8 +
              dVar134 * dVar124 +
              ((dVar170 * (dVar126 + dVar126) * dVar174 +
               auVar117._0_8_ * dVar131 +
               ((dVar130 * dVar192 +
                dVar157 * dVar197 +
                dVar145 * dVar192 +
                dVar126 * dVar167 * dVar179 +
                dVar187 * dVar192 +
                dVar83 * dVar197 + dVar126 * dVar81 * dVar84 + dVar179 * dVar80 * dVar81) -
               (dVar126 + dVar126) * dVar124 * dVar178)) - dVar132 * dVar192)) - dVar178 * dVar165)
             + dVar124 * dVar171 + dVar197 * dStack_13a0 + dVar125 * dVar175;
    auVar48._8_4_ = SUB84(dVar50,0);
    auVar48._0_8_ = dVar107;
    auVar48._12_4_ = (int)((ulong)dVar50 >> 0x20);
    auVar26._8_4_ = SUB84(dVar194,0);
    auVar26._0_8_ = dVar118;
    auVar26._12_4_ = (int)((ulong)dVar194 >> 0x20);
    auVar27._8_4_ = auVar116._8_4_;
    auVar27._0_8_ = dVar183;
    auVar27._12_4_ = auVar116._12_4_;
    uStack_1290._0_4_ = auVar195._8_4_;
    auVar28._8_4_ = (undefined4)uStack_1290;
    auVar28._0_8_ = dVar174;
    auVar28._12_4_ = uStack_1290._4_4_;
    dStack_860 = auVar2._8_8_;
    dVar158 = local_14b8 * local_14b8 +
              dVar79 * local_14b8 +
              dVar192 * local_13b8 * dVar192 +
              dVar165 * dVar170 * dVar170 +
              dVar111 * local_13b8 +
              dVar157 * local_14b8 + dVar165 * dVar81 * dVar179 + local_14b8 * dVar83 +
              dVar82 * local_13b8;
    dVar163 = dVar119 * local_14b8 +
              dVar182 * dVar175 +
              dStack_11f0 * dVar174 * dVar192 +
              dStack_860 * dVar197 +
              (dVar179 + dVar179) * dVar192 * dVar197 +
              dVar171 * dVar179 +
              (((dVar130 * dVar170 +
                dVar130 * dVar124 +
                dVar157 * dVar174 +
                dVar157 * dVar178 +
                dVar108 * dVar170 * dVar170 +
                dVar167 * local_13b8 +
                dVar145 * dVar170 +
                (dVar149 + dVar149) * dVar170 * dVar174 +
                dVar81 * dVar131 +
                dVar187 * dVar170 +
                dVar83 * dVar174 + (dVar156 * dVar84 - dVar108 * (dVar149 + dVar149) * dVar179)) -
               dVar132 * dVar124) - dVar132 * dVar170) + dVar82 * dVar84 +
              dVar84 * dVar192 * dVar192;
    dStack_9e0 = auVar9._8_8_;
    dStack_8b0 = auVar24._8_8_;
    dStack_11c0 = auVar7._8_8_;
    dStack_1170 = auVar10._8_8_;
    dStack_9a0 = auVar8._8_8_;
    dVar156 = (local_14b8 + local_14b8) * dVar175 +
              local_14b8 * dVar161 +
              dVar168 * local_14b8 +
              dVar79 * dVar175 +
              dVar131 * dVar192 * dVar192 +
              dVar185 + dVar170 * dVar180 * dVar170 +
                        local_13b8 * dVar171 +
                        (dVar165 + dVar165) * dVar170 * dVar174 +
                        dVar131 * dVar82 +
                        local_13b8 * dVar134 +
                        -dVar132 * local_14b8 +
                        local_13b8 * dVar184 +
                        dVar131 * dVar111 +
                        dVar130 * local_14b8 +
                        dVar157 * dVar175 +
                        dVar145 * local_14b8 +
                        dVar165 * dVar167 * dVar179 +
                        dVar187 * local_14b8 +
                        dVar175 * dVar83 + dVar84 * dVar165 * dVar81 + dVar179 * dVar180 * dVar81;
    dVar185 = (dVar175 + dVar175) * dVar160 +
              dStack_9a0 * dVar175 +
              dVar161 * dVar160 +
              dVar168 * dVar160 +
              dStack_1170 * dVar197 +
              dStack_11c0 +
              dVar174 * (dVar186 + dVar186) * dVar170 +
              dVar131 * dVar183 +
              dVar174 * dVar180 * dVar174 +
              dVar127 * dStack_8b0 +
              dVar194 * dVar131 +
              dVar134 * dVar127 +
              dVar175 * dVar118 +
              -dVar132 * dVar160 +
              dVar184 * dVar127 +
              dVar130 * dVar160 +
              dStack_9e0 +
              dVar145 * dVar160 +
              dVar186 * dVar167 * dVar179 +
              dVar84 * uStack_1320 + dVar84 * dVar162 + dVar160 * dVar187;
    auVar11._8_4_ = SUB84(dVar185,0);
    auVar11._0_8_ = dVar156;
    auVar11._12_4_ = (int)((ulong)dVar185 >> 0x20);
    dVar112 = dVar136 * dVar86;
    dVar169 = -dVar133;
    dVar172 = -dVar146;
    dVar142 = dVar129 * dVar135;
    dVar191 = dVar169 * dVar86;
    uVar67 = (uint)((ulong)dVar135 >> 0x20);
    uStack_1264 = uVar67 ^ 0x80000000;
    dVar143 = dVar147 * dVar135;
    dVar196 = -dVar147 * dVar113;
    dVar159 = (dVar160 * dVar166 +
              dVar183 * dVar170 +
              dVar171 * dVar174 +
              dVar80 * dVar131 + dVar126 * dVar127 + dVar149 * dVar160 + dVar108 * dVar175) -
              dVar175 * dVar197;
    dVar164 = (dVar183 * dVar174 + dVar108 * dVar160 + dVar80 * dVar127) - dVar160 * dVar197;
    dVar144 = dVar146 * dVar113;
    dVar120 = dVar159 * dVar113;
    dVar185 = -dVar159;
    dVar154 = dVar172 * dVar86;
    dVar121 = dVar185 * dVar86;
    dVar155 = dVar159 * dVar85;
    dVar122 = dVar85 * dVar164;
    dVar166 = dVar174 * dVar174 +
              (((dVar167 * dVar84 + dVar84 * dVar197) - dVar178 * dVar174) - dVar127);
    dStack_fa0 = auVar26._8_8_;
    dStack_13e0 = auVar41._8_8_;
    dVar138 = dVar125 * local_14b8 +
              dVar192 * dVar79 +
              dVar192 * dVar192 * dVar124 +
              local_1148 * dVar124 +
              dVar126 * dVar170 * dVar170 +
              auVar117._0_8_ * local_13b8 +
              ((dVar126 * dVar81 * dVar179 + dVar192 * dVar83 + dVar157 * dVar192) -
              dVar110 * dVar124);
    dStack_13e0 = dStack_13e0 +
                  dVar192 * dStack_1240 +
                  dVar160 * dVar182 +
                  dStack_11f0 * dVar174 * dVar197 +
                  (dVar84 + dVar84) * dVar192 * dVar197 +
                  dVar179 * dVar197 * dVar197 +
                  ((dVar118 * dVar170 +
                    dVar118 * dVar124 +
                    (((dVar130 * dVar174 +
                      dVar130 * dVar178 +
                      (dVar108 + dVar108) * dVar170 * dVar174 +
                      dVar167 * dVar131 +
                      uStack_14f0 * dVar170 +
                      dVar145 * dVar174 +
                      dVar108 * dVar167 * dVar179 +
                      dVar149 * dVar174 * dVar174 +
                      dVar81 * dVar127 + dVar149 * -2.0 * dVar108 * dVar84 + dVar174 * dVar187) -
                     dVar178 * dVar132) - dVar132 * dVar174) + dVar84 * dVar171) - dVar186 * dVar179
                  );
    dStack_1270 = auVar6._8_8_;
    dVar182 = dVar125 * dVar160 +
              dVar174 * 4.0 * dVar192 * dVar197 +
              dVar197 * dVar168 +
              dVar192 * (dVar178 + dVar178) * dVar197 +
              dVar197 * dVar124 * dVar197 +
              dVar183 * dVar124 +
              ((dVar88 + dVar198 * dVar131 +
                         ((dVar118 * dVar192 +
                          ((dVar126 * dVar174 * dVar174 +
                           auVar117._0_8_ * dVar127 +
                           dVar184 * dVar178 +
                           dVar130 * dVar197 +
                           uStack_14f0 * dVar192 +
                           dVar145 * dVar197 +
                           dVar80 * dVar167 * dVar179 +
                           dVar126 * dVar167 * dVar84 + dVar80 * dVar81 * dVar84 + dVar197 * dVar187
                           ) - dVar132 * dVar197)) - dVar124 * (dVar80 + dVar80) * dVar178)) -
              dVar180 * dVar178) + dVar109 * dVar175;
    dVar149 = dStack_1240 * dVar197 +
              dVar84 * dVar197 * dVar197 +
              dVar183 * dVar84 +
              dVar118 * dVar174 +
              dVar178 * dVar118 +
              dVar108 * dVar174 * dVar174 +
              ((dStack_1270 + dVar174 * uStack_14f0) - dVar108 * dVar127) + dVar160 * dVar119;
    dVar81 = dVar175 * dVar175 +
             (local_14b8 + local_14b8) * dVar160 +
             dStack_9a0 * local_14b8 +
             dVar161 * dVar175 +
             dVar168 * dVar175 +
             dVar79 * dVar160 +
             dVar127 * dVar192 * dVar192 +
             (dVar131 + dVar131) * dVar192 * dVar197 +
             local_13b8 * dVar197 * dVar197 +
             dVar186 * dVar170 * dVar170 +
             dVar183 * local_13b8 +
             (dVar180 + dVar180) * dVar170 * dVar174 +
             dVar131 * dVar171 +
             dVar165 * dVar174 * dVar174 +
             dVar82 * dVar127 +
             dVar194 * local_13b8 +
             dVar134 * dVar131 +
             dVar118 * local_14b8 +
             ((dVar184 * dVar131 +
              dVar111 * dVar127 +
              dVar130 * dVar175 +
              dVar157 * dVar160 +
              uStack_14f0 * local_14b8 +
              dVar145 * dVar175 +
              uStack_1320 * dVar179 +
              dVar165 * dVar167 * dVar84 +
              dVar187 * dVar175 + dVar83 * dVar160 + dVar180 * dVar81 * dVar84 + dVar162 * dVar179)
             - dVar132 * dVar175);
    dStack_13d0 = auVar27._8_8_;
    dVar134 = dVar160 * dVar160 +
              dVar160 * dStack_9a0 +
              dVar127 * dVar197 * dVar197 +
              dVar186 * dVar174 * dVar174 +
              dVar127 * dVar183 +
              ((dVar160 * dVar118 + dVar84 * dVar186 * dVar167 + dVar160 * uStack_14f0) -
              dVar127 * dVar193);
    dVar165 = dVar109 * dVar160 +
              dVar197 * dStack_9a0 +
              dVar178 * dVar197 * dVar197 +
              dVar178 * dVar183 +
              dVar80 * dVar174 * dStack_13d0 +
              ((dVar178 * dStack_fa0 +
               dVar197 * dVar118 + dVar80 * dVar167 * dVar84 + dVar197 * uStack_14f0) -
              dVar127 * dVar80);
    dVar50 = auVar11._8_8_;
    uStack_1260 = SUB84(dVar147,0);
    auVar141._0_8_ = -(double)CONCAT44(uVar67,uStack_1260);
    auVar141._8_4_ = uStack_1260;
    auVar141._12_4_ = uStack_1264;
    dVar119 = auVar141._0_8_ * dVar166;
    dVar184 = auVar141._8_8_ * dVar85;
    dVar161 = dVar173 * dVar185;
    dVar132 = dVar173 * -dVar164;
    dVar87 = dVar185 * dVar123;
    uVar152 = SUB84(dVar164 * dVar113,0);
    uVar153 = (undefined4)((ulong)(dVar164 * dVar113) >> 0x20);
    auVar29._8_4_ = uVar152;
    auVar29._0_8_ = dVar87;
    auVar29._12_4_ = uVar153;
    uStack_1290 = auVar28._8_8_;
    dVar180 = local_14b8 * dVar174 +
              dVar170 * dVar175 +
              dVar131 * dVar192 +
              (((dVar179 * dVar171 + dVar82 * dVar84) - dVar124 * dVar175) - dVar178 * local_14b8) +
              local_13b8 * dVar197;
    dVar125 = dVar197 * uStack_1290 + dVar198 * dVar174 + dVar108 * dVar197 + dVar193 + dVar186;
    dVar145 = -dVar125;
    dStack_11e0 = auVar25._8_8_;
    dVar167 = dVar164 * dVar166;
    dStack_1340 = auVar48._8_8_;
    dVar131 = dVar128 * dVar147;
    dVar157 = dVar180 * dVar147;
    dVar160 = dVar133 * dVar166;
    dVar162 = dVar146 * dVar166;
    dVar170 = dVar145 * dVar166;
    dVar159 = dVar159 * dVar166;
    dVar168 = dStack_11e0 * dVar123;
    dVar171 = dVar145 * dVar113;
    dVar183 = dVar123 * dVar139;
    dVar126 = dVar180 * dVar125;
    dVar118 = dStack_11e0 * dVar173;
    dVar127 = dVar128 * dVar129;
    dVar124 = dVar86 * dStack_11e0;
    dVar130 = dVar129 * dVar181;
    dVar82 = dVar173 * dVar169;
    uVar188 = SUB84(dVar173 * dVar172,0);
    uVar189 = (undefined4)((ulong)(dVar173 * dVar172) >> 0x20);
    auVar42._8_4_ = uVar188;
    auVar42._0_8_ = dVar82;
    auVar42._12_4_ = uVar189;
    dVar145 = dVar145 * dVar85;
    auVar49._8_4_ = SUB84(dVar147 * dVar181,0);
    auVar49._0_8_ = dVar145;
    auVar49._12_4_ = (int)((ulong)(dVar147 * dVar181) >> 0x20);
    auVar30._8_4_ = SUB84(dStack_13e0 * dVar191,0);
    auVar30._0_8_ = dVar158 * dVar145;
    auVar30._12_4_ = (int)((ulong)(dStack_13e0 * dVar191) >> 0x20);
    dVar147 = dVar123 * dVar169;
    dVar172 = dVar123 * dVar172;
    dVar179 = dVar129 * dVar180;
    dVar174 = dVar135 * dVar125;
    auVar12._8_4_ = SUB84(dVar159 * dStack_1340,0);
    auVar12._0_8_ = dVar155 * dVar182;
    auVar12._12_4_ = (int)((ulong)(dVar159 * dStack_1340) >> 0x20);
    dVar186 = -dVar129;
    dVar187 = -dVar139;
    dVar84 = dVar123 * dVar136;
    auVar43._8_4_ = SUB84(dVar187 * dVar135,0);
    auVar43._0_8_ = dVar84;
    auVar43._12_4_ = (int)((ulong)(dVar187 * dVar135) >> 0x20);
    dVar88 = dVar85 * dVar186;
    dVar113 = dVar113 * dVar186;
    dVar110 = dVar180 * dVar187;
    auVar13._8_4_ = SUB84(dVar131 * dVar107,0);
    auVar13._0_8_ = dVar113 * dVar156;
    auVar13._12_4_ = (int)((ulong)(dVar131 * dVar107) >> 0x20);
    dVar166 = dVar166 * dVar186;
    dStack_11e0 = -dStack_11e0;
    dVar178 = -dVar136;
    dVar175 = dVar135 * dVar178;
    uStack_1174 = (undefined4)((ulong)dVar185 >> 0x20);
    dStack_1170._0_4_ = SUB84(-dVar164,0);
    auVar90._0_8_ = (double)CONCAT44(uStack_1174,dStack_1170._0_4_);
    auVar90._8_4_ = dStack_1170._0_4_;
    auVar90._12_4_ = uStack_1174;
    dVar108 = auVar90._0_8_ * dVar86;
    dVar123 = auVar90._8_8_ * dVar123;
    dVar86 = dVar86 * dVar139;
    auVar14._8_4_ = SUB84(dStack_11e0 * dVar128,0);
    auVar14._0_8_ = dVar86;
    auVar14._12_4_ = (int)((ulong)(dStack_11e0 * dVar128) >> 0x20);
    dVar185 = dVar128 * dVar187;
    uVar150 = SUB84(dVar128 * dVar125,0);
    uVar151 = (undefined4)((ulong)(dVar128 * dVar125) >> 0x20);
    auVar15._8_4_ = uVar150;
    auVar15._0_8_ = dVar185;
    auVar15._12_4_ = uVar151;
    dVar187 = dVar187 * dVar181;
    dVar125 = dVar125 * dVar181;
    dVar109 = dVar135 * dStack_11e0;
    dVar111 = dVar181 * dVar178;
    dVar181 = dVar181 * dStack_11e0;
    dVar139 = dVar173 * dVar139;
    dStack_11e0 = dVar180 * dStack_11e0;
    dVar180 = dVar180 * dVar178;
    auVar16._8_4_ = SUB84(dVar111,0);
    auVar16._0_8_ = dVar109;
    auVar16._12_4_ = (int)((ulong)dVar111 >> 0x20);
    dVar128 = dVar128 * dVar178;
    auVar44._8_4_ = SUB84(dVar85,0);
    auVar44._0_8_ = dVar85;
    auVar44._12_4_ = (int)((ulong)dVar85 >> 0x20);
    dVar83 = dVar85 * dVar133;
    dVar85 = dVar85 * dVar146;
    uVar190 = (undefined4)((ulong)dVar85 >> 0x20);
    auVar45._8_4_ = SUB84(dVar85,0);
    auVar45._0_8_ = dVar83;
    auVar45._12_4_ = uVar190;
    local_14e8._8_8_ = auVar42._8_8_;
    auVar17._8_4_ = SUB84(dVar107,0);
    auVar17._0_8_ = dVar107;
    auVar17._12_4_ = (int)((ulong)dVar107 >> 0x20);
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
         dVar82 * dVar107 +
         dVar83 * dVar138 +
         dVar142 * dVar107 + dVar88 * dVar158 + dVar158 * dVar137 + dVar175 * dVar138;
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[1] =
         (double)local_14e8._8_8_ * dVar107 +
         dVar85 * dVar138 +
         dVar191 * dVar107 +
         dVar82 * dVar163 +
         dVar138 * dVar148 +
         dVar83 * dStack_1340 +
         dVar143 * dVar107 +
         dVar184 * dVar158 +
         dVar179 * dVar107 +
         dVar142 * dVar163 +
         dVar113 * dVar158 +
         dVar88 * dVar156 +
         dVar109 * dVar138 +
         dVar118 * dVar158 +
         dVar180 * dVar138 + dVar175 * dStack_1340 + dVar137 * dVar156 + dVar112 * dVar158;
    dStack_1310 = auVar43._8_8_;
    dStack_1390 = auVar14._8_8_;
    auVar18._8_4_ = SUB84(dVar81,0);
    auVar18._0_8_ = dVar158;
    auVar18._12_4_ = (int)((ulong)dVar81 >> 0x20);
    dStack_10c0 = auVar13._8_8_;
    dStack_1270 = auVar17._8_8_;
    dStack_1430 = auVar45._8_8_;
    dStack_1150 = auVar30._8_8_;
    auVar31._8_4_ = SUB84(dVar182,0);
    auVar31._0_8_ = dVar182;
    auVar31._12_4_ = (int)((ulong)dVar182 >> 0x20);
    dStack_1400 = auVar16._8_8_;
    dStack_1370 = auVar49._8_8_;
    dStack_f20 = auVar18._8_8_;
    dStack_14a0 = auVar15._8_8_;
    dVar79 = dVar182 * dVar187 +
             dVar165 * dVar185 +
             dVar50 * dVar183 + dVar134 * dVar86 + dVar134 * dVar168 + dVar181 * dVar165;
    dVar80 = dVar163 * dVar125 +
             dStack_13e0 * dStack_14a0 +
             dVar149 * dVar126 +
             dVar170 * dVar81 +
             dVar50 * dVar171 +
             dVar145 * dVar134 +
             dStack_1370 * dStack_13e0 +
             dVar131 * dVar149 +
             dVar50 * dVar119 +
             dVar196 * dVar134 +
             dVar130 * dVar149 +
             dVar166 * dVar134 +
             dVar187 * dStack_1340 +
             dVar185 * dVar182 +
             dVar110 * dVar165 +
             dVar81 * dVar183 +
             dVar86 * dVar50 +
             dVar139 * dVar134 +
             dVar181 * dVar182 +
             dStack_1390 * dVar165 +
             dVar168 * dVar50 + dVar124 * dVar134 + dVar84 * dVar134 + dVar111 * dVar165;
    auVar32._8_4_ = SUB84(dVar80,0);
    auVar32._0_8_ = dVar79;
    auVar32._12_4_ = (int)((ulong)dVar80 >> 0x20);
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
         dVar161 * dVar107 +
         dVar138 * dVar155 +
         dVar154 * dVar107 +
         (double)local_14e8._8_8_ * dVar163 +
         dVar144 * dVar138 +
         dStack_1430 * dStack_1340 +
         dVar147 * dVar107 +
         dVar191 * dVar163 +
         dVar82 * dStack_13e0 +
         dVar160 * dVar138 +
         dVar148 * dStack_1340 +
         dVar83 * dVar182 +
         dVar184 * dVar156 +
         dVar127 * dVar107 +
         dVar179 * dVar163 +
         dVar88 * dVar81 +
         dStack_1310 * dVar138 +
         dStack_11e0 * dVar138 +
         dVar158 * dVar124 +
         dVar156 * dVar118 +
         dVar128 * dVar138 +
         dVar180 * dStack_1340 +
         dVar175 * dVar182 + dVar84 * dVar158 + dVar112 * dVar156 + dVar81 * dVar137 +
         dVar109 * dStack_1340 + dVar139 * dVar158 + dVar113 * dVar156 + dVar166 * dVar158 +
         dStack_13e0 * dVar142 + dVar158 * dVar196 + dVar163 * dVar143 + dVar107 * dVar157 +
         dVar158 * dVar145 + dVar107 * dVar174;
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
         dVar132 * dStack_1270 +
         dVar138 * dVar122 +
         dVar121 * dStack_1270 +
         dVar161 * dVar163 +
         dVar120 * dVar138 +
         dVar155 * dStack_1340 +
         dVar172 * dStack_1270 +
         dVar154 * dVar163 +
         (double)local_14e8._8_8_ * dStack_13e0 +
         dVar162 * dVar138 +
         dVar144 * dStack_1340 +
         dStack_1430 * dVar182 +
         dVar83 * dVar165 +
         dVar126 * dStack_1270 +
         dVar174 * dVar163 +
         dVar157 * dVar163 +
         dVar143 * dStack_13e0 +
         dVar196 * dVar156 +
         dVar107 * dVar130 +
         dVar163 * dVar127 +
         dVar179 * dStack_13e0 +
         dVar142 * dVar149 +
         dVar166 * dVar156 +
         dVar113 * dVar81 +
         dVar110 * dVar138 +
         dStack_1310 * dStack_1340 +
         dVar86 * dVar158 +
         dVar139 * dVar156 +
         dStack_1390 * dVar138 +
         dStack_11e0 * dStack_1340 +
         dVar109 * dVar182 +
         dVar168 * dVar158 +
         dVar124 * dVar156 +
         dVar118 * dVar81 +
         dVar111 * dVar138 +
         dVar128 * dStack_1340 +
         dVar180 * dVar182 +
         dVar175 * dVar165 + dVar84 * dVar156 + dVar137 * dVar50 + dVar112 * dVar81 +
         dVar88 * dVar50 + dVar81 * dVar184 + dVar119 * dVar158 + dStack_10c0 + dVar145 * dVar156 +
         dVar158 * dVar171 + dVar182 * dVar148 + dStack_1340 * dVar160 + dVar149 * dVar82 +
         dStack_1150 + dVar163 * dVar147;
    dStack_1350 = auVar31._8_8_;
    dStack_1240 = auVar29._8_8_;
    dStack_1110 = auVar12._8_8_;
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
         dVar107 * dVar108 +
         dVar132 * dVar163 +
         dStack_1240 * dVar138 +
         dVar87 * dVar107 +
         dVar163 * dVar121 +
         dVar159 * dVar138 +
         dStack_1340 * dVar120 +
         dVar172 * dVar163 +
         dStack_13e0 * dVar154 +
         (double)local_14e8._8_8_ * dVar149 +
         dVar162 * dStack_1340 +
         dVar144 * dVar182 +
         dStack_1430 * dVar165 +
         dStack_13e0 * dVar147 +
         dVar149 * dVar191 +
         dVar182 * dVar160 +
         dVar165 * dVar148 +
         dStack_14a0 * dVar107 +
         dVar126 * dVar163 +
         dStack_13e0 * dVar174 +
         dVar170 * dVar158 +
         dVar171 * dVar156 +
         dVar81 * dVar145 +
         dStack_1370 * dVar107 +
         dVar131 * dVar163 +
         dStack_13e0 * dVar157 +
         dVar149 * dVar143 +
         dVar156 * dVar119 +
         dVar81 * dVar196 +
         dVar184 * dVar50 +
         dVar163 * dVar130 +
         dStack_13e0 * dVar127 +
         dVar149 * dVar179 +
         dVar81 * dVar166 +
         dVar113 * dVar50 +
         dVar88 * dVar134 +
         dVar185 * dVar138 +
         dStack_1340 * dVar110 +
         dVar182 * dStack_1310 +
         dVar158 * dVar183 +
         dVar156 * dVar86 +
         dVar81 * dVar139 +
         dVar138 * dVar181 +
         dStack_1340 * dStack_1390 +
         dVar182 * dStack_11e0 +
         dVar165 * dVar109 +
         dVar168 * dVar156 +
         dVar81 * dVar124 +
         dVar118 * dVar50 +
         dVar111 * dStack_1340 +
         dVar128 * dVar182 +
         dVar180 * dVar165 + dVar84 * dVar81 + dVar137 * dVar134 + dVar112 * dVar50 +
         dVar155 * dVar182 + dStack_13e0 * dVar161 + dStack_1340 * dVar122;
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
         dStack_1270 * dVar123 +
         dVar108 * dVar163 +
         dVar132 * dStack_13e0 +
         dStack_1240 * dStack_1340 +
         dVar182 * dVar122 +
         dVar121 * dStack_13e0 +
         dVar149 * dVar161 +
         dVar120 * dVar182 +
         dVar165 * dVar155 +
         dVar172 * dStack_13e0 +
         dVar154 * dVar149 +
         dVar162 * dStack_1350 +
         dVar144 * dVar165 +
         dVar149 * dVar147 +
         dVar165 * dVar160 +
         dVar107 * dVar125 +
         dVar163 * dStack_14a0 +
         dVar126 * dStack_13e0 +
         dVar174 * dVar149 +
         dVar156 * dVar170 +
         dVar171 * dStack_f20 +
         dVar145 * dVar50 +
         dVar163 * dStack_1370 +
         dVar131 * dStack_13e0 +
         dVar157 * dVar149 +
         dVar81 * dVar119 +
         dVar50 * dVar196 +
         dVar134 * dVar184 +
         dStack_13e0 * dVar130 +
         dVar127 * dVar149 +
         dVar50 * dVar166 +
         dVar134 * dVar113 +
         dVar138 * dVar187 +
         dStack_1340 * dVar185 +
         dVar110 * dVar182 +
         dStack_1310 * dVar165 +
         dVar183 * dVar156 +
         dVar81 * dVar86 +
         dVar50 * dVar139 +
         dStack_1340 * dVar181 +
         dVar182 * dStack_1390 +
         dVar165 * dStack_11e0 +
         dVar168 * dVar81 +
         dVar50 * dVar124 +
         dVar134 * dVar118 +
         dVar182 * dStack_1400 + dVar128 * dVar165 + dVar112 * dVar134 + dVar84 * dVar50 +
         dStack_1110 + dVar87 * dVar163 + dVar138 * dVar167;
    dStack_1150 = auVar32._8_8_;
    dVar156 = dStack_13e0 * dVar123 +
              dVar108 * dVar149 +
              dVar167 * dVar182 +
              dStack_1240 * dVar165 +
              dVar149 * dVar87 +
              dVar159 * dVar165 +
              dVar125 * dStack_13e0 +
              dStack_14a0 * dVar149 +
              dVar50 * dVar170 +
              dVar171 * dVar134 + dStack_1370 * dVar149 + dVar119 * dVar134 + dVar79;
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
         dVar149 * dVar123 +
         dVar165 * dVar167 +
         dVar125 * dVar149 + dVar170 * dVar134 + dVar183 * dVar134 + dVar187 * dVar165;
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7].
    _0_4_ = SUB84(dVar156,0);
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[6] =
         dVar163 * dVar123 +
         dVar108 * dStack_13e0 +
         dVar132 * dVar149 +
         dStack_1340 * dVar167 +
         dVar182 * dStack_1240 +
         dVar122 * dVar165 +
         dVar87 * dStack_13e0 +
         dVar121 * dVar149 +
         dVar182 * dVar159 + dVar120 * dVar165 + dVar172 * dVar149 + dVar162 * dVar165 + dStack_1150
    ;
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7].
    _4_4_ = (int)((ulong)dVar156 >> 0x20);
    calc_realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    calc_realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    calc_realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Eigen::PolynomialSolver<double,_-1>::PolynomialSolver(&solver);
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)&coeff,8);
    if ((*pSVar68 != 0.0) || (NAN(*pSVar68))) {
      Eigen::PolynomialSolver<double,-1>::compute<Eigen::Matrix<double,9,1,0,9,1>>
                ((PolynomialSolver<double,_1> *)&solver,&coeff);
      TP.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
           1e-12;
      Eigen::PolynomialSolverBase<double,-1>::realRoots<std::vector<double,std::allocator<double>>>
                ((PolynomialSolverBase<double,_1> *)&solver,&calc_realRoots,(RealScalar *)&TP);
      local_1508._4_4_ = (undefined4)((ulong)dVar168 >> 0x20);
      local_1508._8_4_ = SUB84(dVar171,0);
      uStack_14fc = (undefined4)((ulong)dVar171 >> 0x20);
      auVar51._4_8_ = dVar160;
      auVar51._0_4_ = local_1508._4_4_;
      auVar91._0_8_ = auVar51._0_8_ << 0x20;
      auVar91._8_4_ = local_1508._8_4_;
      auVar91._12_4_ = uStack_14fc;
      uVar69 = (long)calc_realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)calc_realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_14e8._4_4_ = (undefined4)((ulong)dVar82 >> 0x20);
      auVar52._4_8_ = auVar91._8_8_;
      auVar52._0_4_ = local_14e8._4_4_;
      auVar92._0_8_ = auVar52._0_8_ << 0x20;
      auVar92._8_4_ = uVar188;
      auVar92._12_4_ = uVar189;
      uStack_14d4 = (undefined4)((ulong)dVar142 >> 0x20);
      uStack_14d0 = SUB84(dVar191,0);
      uStack_14cc = (undefined4)((ulong)dVar191 >> 0x20);
      auVar53._4_8_ = auVar92._8_8_;
      auVar53._0_4_ = uStack_14d4;
      auVar93._0_8_ = auVar53._0_8_ << 0x20;
      auVar93._8_4_ = uStack_14d0;
      auVar93._12_4_ = uStack_14cc;
      uStack_1434 = (undefined4)((ulong)dVar83 >> 0x20);
      auVar54._4_8_ = auVar93._8_8_;
      auVar54._0_4_ = uStack_1434;
      auVar94._0_8_ = auVar54._0_8_ << 0x20;
      auVar94._8_4_ = SUB84(dVar85,0);
      auVar94._12_4_ = uVar190;
      uStack_12a4 = (undefined4)((ulong)dVar161 >> 0x20);
      uStack_12a0 = SUB84(dVar132,0);
      uStack_129c = (undefined4)((ulong)dVar132 >> 0x20);
      auVar55._4_8_ = auVar94._8_8_;
      auVar55._0_4_ = uStack_12a4;
      auVar95._0_8_ = auVar55._0_8_ << 0x20;
      auVar95._8_4_ = uStack_12a0;
      auVar95._12_4_ = uStack_129c;
      uStack_1474 = (undefined4)((ulong)dVar155 >> 0x20);
      uStack_1470._0_4_ = SUB84(dVar122,0);
      uStack_1470._4_4_ = (undefined4)((ulong)dVar122 >> 0x20);
      auVar56._4_8_ = auVar95._8_8_;
      auVar56._0_4_ = uStack_1474;
      auVar96._0_8_ = auVar56._0_8_ << 0x20;
      auVar96._8_4_ = (undefined4)uStack_1470;
      auVar96._12_4_ = uStack_1470._4_4_;
      uStack_1224 = (undefined4)((ulong)dVar154 >> 0x20);
      uStack_1220 = SUB84(dVar121,0);
      uStack_121c = (undefined4)((ulong)dVar121 >> 0x20);
      auVar57._4_8_ = auVar96._8_8_;
      auVar57._0_4_ = uStack_1224;
      auVar97._0_8_ = auVar57._0_8_ << 0x20;
      auVar97._8_4_ = uStack_1220;
      auVar97._12_4_ = uStack_121c;
      uStack_1324 = (undefined4)((ulong)dVar144 >> 0x20);
      uStack_1320._0_4_ = SUB84(dVar120,0);
      uStack_1320._4_4_ = (undefined4)((ulong)dVar120 >> 0x20);
      auVar58._4_8_ = auVar97._8_8_;
      auVar58._0_4_ = uStack_1324;
      auVar98._0_8_ = auVar58._0_8_ << 0x20;
      auVar98._8_4_ = (undefined4)uStack_1320;
      auVar98._12_4_ = uStack_1320._4_4_;
      uStack_1124 = (undefined4)((ulong)dVar147 >> 0x20);
      uStack_1120 = SUB84(dVar172,0);
      uStack_111c = (undefined4)((ulong)dVar172 >> 0x20);
      auVar59._4_8_ = auVar98._8_8_;
      auVar59._0_4_ = uStack_1124;
      auVar99._0_8_ = auVar59._0_8_ << 0x20;
      auVar99._8_4_ = uStack_1120;
      auVar99._12_4_ = uStack_111c;
      uStack_1244 = (undefined4)((ulong)dVar87 >> 0x20);
      auVar60._4_8_ = auVar99._8_8_;
      auVar60._0_4_ = uStack_1244;
      auVar100._0_8_ = auVar60._0_8_ << 0x20;
      auVar100._8_4_ = uVar152;
      auVar100._12_4_ = uVar153;
      local_1498._4_4_ = (undefined4)((ulong)dVar170 >> 0x20);
      local_1498._8_4_ = SUB84(dVar159,0);
      uStack_148c = (undefined4)((ulong)dVar159 >> 0x20);
      auVar61._4_8_ = auVar100._8_8_;
      auVar61._0_4_ = local_1498._4_4_;
      auVar101._0_8_ = auVar61._0_8_ << 0x20;
      auVar101._8_4_ = local_1498._8_4_;
      auVar101._12_4_ = uStack_148c;
      uStack_14a4 = (undefined4)((ulong)dVar185 >> 0x20);
      auVar62._4_8_ = auVar101._8_8_;
      auVar62._0_4_ = uStack_14a4;
      auVar102._0_8_ = auVar62._0_8_ << 0x20;
      auVar102._8_4_ = uVar150;
      auVar102._12_4_ = uVar151;
      local_14c8._4_4_ = (undefined4)((ulong)dVar183 >> 0x20);
      local_14c8._8_4_ = SUB84(dVar126,0);
      uStack_14bc = (undefined4)((ulong)dVar126 >> 0x20);
      auVar63._4_8_ = auVar102._8_8_;
      auVar63._0_4_ = local_14c8._4_4_;
      auVar103._0_8_ = auVar63._0_8_ << 0x20;
      auVar103._8_4_ = local_14c8._8_4_;
      auVar103._12_4_ = uStack_14bc;
      uStack_1424 = (undefined4)((ulong)dVar179 >> 0x20);
      uStack_1420 = SUB84(dVar174,0);
      uStack_141c = (undefined4)((ulong)dVar174 >> 0x20);
      auVar64._4_8_ = auVar103._8_8_;
      auVar64._0_4_ = uStack_1424;
      auVar104._0_8_ = auVar64._0_8_ << 0x20;
      auVar104._8_4_ = uStack_1420;
      auVar104._12_4_ = uStack_141c;
      uStack_1414 = (undefined4)((ulong)dVar131 >> 0x20);
      uStack_1410 = SUB84(dVar157,0);
      uStack_140c = (undefined4)((ulong)dVar157 >> 0x20);
      auVar65._4_8_ = auVar104._8_8_;
      auVar65._0_4_ = uStack_1414;
      auVar105._0_8_ = auVar65._0_8_ << 0x20;
      auVar105._8_4_ = uStack_1410;
      auVar105._12_4_ = uStack_140c;
      uStack_14f4 = (undefined4)((ulong)dVar118 >> 0x20);
      uStack_14f0._0_4_ = SUB84(dVar127,0);
      uStack_14f0._4_4_ = (undefined4)((ulong)dVar127 >> 0x20);
      auVar66._4_8_ = auVar105._8_8_;
      auVar66._0_4_ = uStack_14f4;
      auVar106._0_8_ = auVar66._0_8_ << 0x20;
      auVar106._8_4_ = (undefined4)uStack_14f0;
      auVar106._12_4_ = uStack_14f0._4_4_;
      for (uVar74 = 0; (uVar69 >> 3 & 0xffffffff) != uVar74; uVar74 = uVar74 + 1) {
        Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&TP,4,4);
        dVar156 = calc_realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar74];
        dStack_1210 = auVar44._8_8_;
        dVar88 = dVar170 * dVar156 * dVar156 * dVar156 * dVar156 +
                 auVar91._8_8_ * dVar156 * dVar156 * dVar156 +
                 dVar145 * dVar156 * dVar156 +
                 dVar119 * dVar156 * dVar156 * dVar156 +
                 dVar196 * dVar156 * dVar156 +
                 dVar184 * dVar156 +
                 dVar166 * dVar156 * dVar156 +
                 dVar113 * dVar156 +
                 dStack_1210 * dVar186 +
                 dVar183 * dVar156 * dVar156 * dVar156 * dVar156 +
                 dVar86 * dVar156 * dVar156 * dVar156 +
                 dVar156 * dVar139 * dVar156 +
                 dVar168 * dVar156 * dVar156 * dVar156 +
                 dVar124 * dVar156 * dVar156 +
                 dVar118 * dVar156 +
                 dVar84 * dVar156 * dVar156 + dVar173 * dVar136 + dVar112 * dVar156;
        dVar80 = (dVar123 * dVar156 * dVar156 * dVar156 * dVar156 * dVar156 +
                 dVar108 * dVar156 * dVar156 * dVar156 * dVar156 +
                 auVar95._8_8_ * dVar156 * dVar156 * dVar156 +
                 dVar87 * dVar156 * dVar156 * dVar156 * dVar156 +
                 auVar97._8_8_ * dVar156 * dVar156 * dVar156 +
                 dVar161 * dVar156 * dVar156 +
                 auVar99._8_8_ * dVar156 * dVar156 * dVar156 +
                 dVar154 * dVar156 * dVar156 +
                 auVar92._8_8_ * dVar156 +
                 dVar147 * dVar156 * dVar156 +
                 auVar93._8_8_ * dVar156 +
                 dVar125 * dVar156 * dVar156 * dVar156 * dVar156 * dVar156 +
                 auVar102._8_8_ * dVar156 * dVar156 * dVar156 * dVar156 +
                 auVar103._8_8_ * dVar156 * dVar156 * dVar156 +
                 auVar104._8_8_ * dVar156 * dVar156 +
                 dStack_1370 * dVar156 * dVar156 * dVar156 * dVar156 +
                 dVar131 * dVar156 * dVar156 * dVar156 +
                 auVar105._8_8_ * dVar156 * dVar156 +
                 dVar143 * dVar156 +
                 dVar130 * dVar156 * dVar156 * dVar156 +
                 auVar106._8_8_ * dVar156 * dVar156 + dVar129 * dVar135 + dVar179 * dVar156 +
                 dVar173 * dVar169) / dVar88;
        dVar88 = (dVar167 * dVar156 * dVar156 * dVar156 * dVar156 * dVar156 +
                 auVar100._8_8_ * dVar156 * dVar156 * dVar156 * dVar156 +
                 auVar96._8_8_ * dVar156 * dVar156 * dVar156 +
                 auVar101._8_8_ * dVar156 * dVar156 * dVar156 * dVar156 +
                 auVar98._8_8_ * dVar156 * dVar156 * dVar156 +
                 dVar155 * dVar156 * dVar156 +
                 dVar162 * dVar156 * dVar156 * dVar156 +
                 dVar144 * dVar156 * dVar156 +
                 dVar156 * auVar94._8_8_ +
                 dVar160 * dVar156 * dVar156 +
                 dVar148 * dVar156 +
                 dStack_1210 * dVar133 +
                 dVar187 * dVar156 * dVar156 * dVar156 * dVar156 * dVar156 +
                 dVar185 * dVar156 * dVar156 * dVar156 * dVar156 +
                 dVar110 * dVar156 * dVar156 * dVar156 +
                 dStack_1310 * dVar156 * dVar156 +
                 dVar156 * dVar181 * dVar156 * dVar156 * dVar156 +
                 dStack_1390 * dVar156 * dVar156 * dVar156 +
                 dStack_11e0 * dVar156 * dVar156 +
                 dVar109 * dVar156 +
                 dVar111 * dVar156 * dVar156 * dVar156 +
                 dVar128 * dVar156 * dVar156 + dVar180 * dVar156 + dVar178 * dVar135) / dVar88;
        dVar50 = 1.0 - dVar156 * dVar156;
        dVar79 = dVar156 * dVar156 + 1.0;
        local_f10 = dVar88 * dVar88 + dVar79 + dVar80 * dVar80;
        local_ed0 = (dVar88 * -dVar88 + dVar79 + dVar80 * -dVar80) / local_f10;
        dVar156 = dVar156 + dVar156;
        dVar79 = dVar80 + dVar80;
        local_ed8 = (dVar156 * dVar80 - (dVar88 + dVar88)) / local_f10;
        local_ee0 = (dVar79 + dVar156 * dVar88) / local_f10;
        local_ee8 = (dVar156 * dVar80 + dVar88 + dVar88) / local_f10;
        local_ef0 = ((dVar80 * dVar80 + dVar50) - dVar88 * dVar88) / local_f10;
        local_ef8 = (dVar79 * dVar88 - dVar156) / local_f10;
        local_f00 = (dVar156 * dVar88 - dVar79) / local_f10;
        local_f08 = (dVar79 * dVar88 + dVar156) / local_f10;
        local_f10 = ((dVar50 - dVar80 * dVar80) + dVar88 * dVar88) / local_f10;
        Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                  ((Type *)&outi,(MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&TP,3,3);
        Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
        ::CommaInitializer(&local_788,
                           (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&outi,
                           &local_ed0);
        pCVar70 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(&local_788,&local_ed8);
        pCVar70 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar70,&local_ee0);
        pCVar70 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar70,&local_ee8);
        pCVar70 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar70,&local_ef0);
        pCVar70 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar70,&local_ef8);
        pCVar70 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar70,&local_f00);
        pCVar70 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar70,&local_f08);
        Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
        ::operator_(pCVar70,&local_f10);
        Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
        ::finished(&local_788);
        local_788.m_xpr = (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TV;
        local_788.m_col = (Index)&TU;
        local_788.m_row = (Index)&TP;
        Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
        _set_noalias<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&outi,
                   (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                    *)&local_788);
        std::
        vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&outi);
      }
    }
    Eigen::PolynomialSolver<double,_-1>::~PolynomialSolver(&solver);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&calc_realRoots.super__Vector_base<double,_std::allocator<double>_>);
    std::
    _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~_Vector_base(&local_d70);
    return __return_storage_ptr__;
  }
  poVar71 = std::operator<<((ostream *)&std::cerr,
                            "Solver 3L1Q requires at least 1 point, and 3 line pairs!");
  std::endl<char,std::char_traits<char>>(poVar71);
  exit(-1);
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver3L1Q_New(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 point, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> P1, P1_B, Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, Q31, Q32, R31_B, R32_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;

	Q11 = lPair[0].first.first; Q12 = lPair[0].first.second;
	R11_B = lPair[0].second.first; R12_B = lPair[0].second.second;
	Q21 = lPair[1].first.first; Q22 = lPair[1].first.second;
	R21_B = lPair[1].second.first; R22_B = lPair[1].second.second;
	Q31 = lPair[2].first.first; Q32 = lPair[2].first.second;
	R31_B = lPair[2].second.first; R32_B = lPair[2].second.second;


	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP11, tP12, tP21, tP22, tP31, tP32, tQ11, tQ12, tQ21, tQ22, tQ31, tQ32;
	// points first lines
	tP11 = Q11.head(3) / Q11(3);
	tP12 = Q12.head(3) / Q12(3);
	tQ11 = R11_B.head(3) / R11_B(3);
	tQ12 = R12_B.head(3) / R12_B(3);
	// points second lines
	tP21 = Q21.head(3) / Q21(3);
	tP22 = Q22.head(3) / Q22(3);
	tQ21 = R21_B.head(3) / R21_B(3);
	tQ22 = R22_B.head(3) / R22_B(3);
	// points third lines
	tP31 = Q31.head(3) / Q31(3);
	tP32 = Q32.head(3) / Q32(3);
	tQ31 = R31_B.head(3) / R31_B(3);
	tQ32 = R32_B.head(3) / R32_B(3);

	// computing the plucker coordinates of the lines
	// ref A
	Matrix<floatPrec, 3,1> D1 = tP12 - tP11;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP12.cross(tP11);
	L1 /= L1.head(3).norm();
	Matrix<floatPrec, 3,1> D2 = tP22 - tP21;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tP22.cross(tP21);
	L2 /= L2.head(3).norm();
	Matrix<floatPrec, 3,1> D3 = tP32 - tP31;
	Matrix<floatPrec, 6,1> L3;
	L3.head(3) = D3;
	L3.tail(3) = tP32.cross(tP31);
	L3 /= L3.head(3).norm();
	// ref B
	D1 = tQ12 - tQ11;
	Matrix<floatPrec, 6,1> M1;
	M1.head(3) = D1;
	M1.tail(3) = tQ12.cross(tQ11);
	M1 /= M1.head(3).norm();
	D2 = tQ22 - tQ21;
	Matrix<floatPrec, 6,1> M2;
	M2.head(3) = D2;
	M2.tail(3) = tQ22.cross(tQ21);
	M2 /= M2.head(3).norm();
	D3 = tQ32 - tQ31;
	Matrix<floatPrec, 6,1> M3;
	M3.head(3) = D3;
	M3.tail(3) = tQ32.cross(tQ31);
	M3 /= M3.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations3L1Q(P1, P1_B);
	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_1, L2_1, L3_1, M1_1, M2_1, M3_1;
	L1_1 = transLineU * L1;
	L2_1 = transLineU * L2;
	L3_1 = transLineU * L3;
	M1_1 = transLineV * M1;
	M2_1 = transLineV * M2;
	M3_1 = transLineV * M3;

	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26, l31, l32, l33, l34, l35, l36;
	floatPrec m11, m12, m13, m14, m15, m16, m21, m22, m23, m24, m25, m26, m31, m32, m33, m34, m35, m36;

	l11 = L1_1[0];
	l12 = L1_1[1];
	l13 = L1_1[2];
	l14 = L1_1[3];
	l15 = L1_1[4];
	l16 = L1_1[5];
	l21 = L2_1[0];
	l22 = L2_1[1];
	l23 = L2_1[2];
	l24 = L2_1[3];
	l25 = L2_1[4];
	l26 = L2_1[5];
	l31 = L3_1[0];
	l32 = L3_1[1];
	l33 = L3_1[2];
	l34 = L3_1[3];
	l35 = L3_1[4];
	l36 = L3_1[5];
	
	m11 = M1_1[0];
	m12 = M1_1[1];
	m13 = M1_1[2];
	m14 = M1_1[3];
	m15 = M1_1[4];
	m16 = M1_1[5];
	m21 = M2_1[0];
	m22 = M2_1[1];
	m23 = M2_1[2];
	m24 = M2_1[3];
	m25 = M2_1[4];
	m26 = M2_1[5];
	m31 = M3_1[0];
	m32 = M3_1[1];
	m33 = M3_1[2];
	m34 = M3_1[3];
	m35 = M3_1[4];
	m36 = M3_1[5];

	floatPrec k1_0, k1_1, k1_2, k1_3, k1_4, k1_5, k1_6, k1_7, k1_8, k1_9;
	k1_0 = l11*m14 + l12*m15 + l13*m16 + l14*m11 + l15*m12 + l16*m13;
	k1_1 = 2*l11*m15 - 2*l12*m14 + 2*l14*m12 - 2*l15*m11;
	k1_2 = -l11*m14 - l12*m15 + l13*m16 - l14*m11 - l15*m12 + l16*m13;
	k1_3 = -2*l11*m16 + 2*l13*m14 - 2*l14*m13 + 2*l16*m11;
	k1_4 = 2*l12*m16 + 2*l13*m15 + 2*l15*m13 + 2*l16*m12;
	k1_5 = -l11*m14 + l12*m15 - l13*m16 - l14*m11 + l15*m12 - l16*m13;
	k1_6 = 2*l12*m16 - 2*l13*m15 + 2*l15*m13 - 2*l16*m12;
	k1_7 = 2*l11*m16 + 2*l13*m14 + 2*l14*m13 + 2*l16*m11;
	k1_8 = 2*l11*m15 + 2*l12*m14 + 2*l14*m12 + 2*l15*m11;
	k1_9 = l11*m14 - l12*m15 - l13*m16 + l14*m11 - l15*m12 - l16*m13;

	floatPrec k2_0, k2_1, k2_2, k2_3, k2_4, k2_5, k2_6, k2_7, k2_8, k2_9;
	k2_0 = l21*m24 + l22*m25 + l23*m26 + l24*m21 + l25*m22 + l26*m23;
	k2_1 = 2*l21*m25 - 2*l22*m24 + 2*l24*m22 - 2*l25*m21;
	k2_2 = -l21*m24 - l22*m25 + l23*m26 - l24*m21 - l25*m22 + l26*m23;
	k2_3 = -2*l21*m26 + 2*l23*m24 - 2*l24*m23 + 2*l26*m21;
	k2_4 = 2*l22*m26 + 2*l23*m25 + 2*l25*m23 + 2*l26*m22;
	k2_5 = -l21*m24 + l22*m25 - l23*m26 - l24*m21 + l25*m22 - l26*m23;
	k2_6 = 2*l22*m26 - 2*l23*m25 + 2*l25*m23 - 2*l26*m22;
	k2_7 = 2*l21*m26 + 2*l23*m24 + 2*l24*m23 + 2*l26*m21;
	k2_8 = 2*l21*m25 + 2*l22*m24 + 2*l24*m22 + 2*l25*m21;
	k2_9 = l21*m24 - l22*m25 - l23*m26 + l24*m21 - l25*m22 - l26*m23;

	floatPrec k3_0, k3_1, k3_2, k3_3, k3_4, k3_5, k3_6, k3_7, k3_8, k3_9;
	k3_0 = l31*m34 + l32*m35 + l33*m36 + l34*m31 + l35*m32 + l36*m33;
	k3_1 = 2*l31*m35 - 2*l32*m34 + 2*l34*m32 - 2*l35*m31;
	k3_2 = -l31*m34 - l32*m35 + l33*m36 - l34*m31 - l35*m32 + l36*m33;
	k3_3 = -2*l31*m36 + 2*l33*m34 - 2*l34*m33 + 2*l36*m31;
	k3_4 = 2*l32*m36 + 2*l33*m35 + 2*l35*m33 + 2*l36*m32;
	k3_5 = -l31*m34 + l32*m35 - l33*m36 - l34*m31 + l35*m32 - l36*m33;
	k3_6 = 2*l32*m36 - 2*l33*m35 + 2*l35*m33 - 2*l36*m32;
	k3_7 = 2*l31*m36 + 2*l33*m34 + 2*l34*m33 + 2*l36*m31;
	k3_8 = 2*l31*m35 + 2*l32*m34 + 2*l34*m32 + 2*l35*m31;
	k3_9 = l31*m34 - l32*m35 - l33*m36 + l34*m31 - l35*m32 - l36*m33;

	floatPrec m1_0, m1_1;
	m1_0 = (k1_2*k2_3*k3_4 - k1_2*k2_4*k3_3 - k1_3*k2_2*k3_4 + k1_3*k2_4*k3_2 + k1_4*k2_2*k3_3 - k1_4*k2_3*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m1_1 = (-k1_2*k2_4*k3_8 + k1_2*k2_8*k3_4 + k1_4*k2_2*k3_8 - k1_4*k2_8*k3_2 - k1_8*k2_2*k3_4 + k1_8*k2_4*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m2_0, m2_1;
	m2_0 = (-k1_1*k2_2*k3_4 + k1_1*k2_4*k3_2 + k1_2*k2_1*k3_4 - k1_2*k2_4*k3_1 - k1_4*k2_1*k3_2 + k1_4*k2_2*k3_1)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m2_1 = (-k1_2*k2_4*k3_7 + k1_2*k2_7*k3_4 + k1_4*k2_2*k3_7 - k1_4*k2_7*k3_2 - k1_7*k2_2*k3_4 + k1_7*k2_4*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m3_0, m3_1, m3_2;
	m3_0 = (-k1_0*k2_2*k3_4 + k1_0*k2_4*k3_2 + k1_2*k2_0*k3_4 - k1_2*k2_4*k3_0 - k1_4*k2_0*k3_2 + k1_4*k2_2*k3_0)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m3_1 = (-k1_2*k2_4*k3_6 + k1_2*k2_6*k3_4 + k1_4*k2_2*k3_6 - k1_4*k2_6*k3_2 - k1_6*k2_2*k3_4 + k1_6*k2_4*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m3_2 = (-k1_2*k2_4*k3_9 + k1_2*k2_9*k3_4 + k1_4*k2_2*k3_9 - k1_4*k2_9*k3_2 - k1_9*k2_2*k3_4 + k1_9*k2_4*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m4_0, m4_1;
	m4_0 = (-k1_3*k2_4*k3_5 + k1_3*k2_5*k3_4 + k1_4*k2_3*k3_5 - k1_4*k2_5*k3_3 - k1_5*k2_3*k3_4 + k1_5*k2_4*k3_3)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m4_1 = (-k1_4*k2_5*k3_8 + k1_4*k2_8*k3_5 + k1_5*k2_4*k3_8 - k1_5*k2_8*k3_4 - k1_8*k2_4*k3_5 + k1_8*k2_5*k3_4)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m5_0, m5_1;
	m5_0 = (-k1_1*k2_4*k3_5 + k1_1*k2_5*k3_4 + k1_4*k2_1*k3_5 - k1_4*k2_5*k3_1 - k1_5*k2_1*k3_4 + k1_5*k2_4*k3_1)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m5_1 = (-k1_4*k2_5*k3_7 + k1_4*k2_7*k3_5 + k1_5*k2_4*k3_7 - k1_5*k2_7*k3_4 - k1_7*k2_4*k3_5 + k1_7*k2_5*k3_4)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m6_0, m6_1, m6_2;
	m6_0 = (-k1_0*k2_4*k3_5 + k1_0*k2_5*k3_4 + k1_4*k2_0*k3_5 - k1_4*k2_5*k3_0 - k1_5*k2_0*k3_4 + k1_5*k2_4*k3_0)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m6_1 = (-k1_4*k2_5*k3_6 + k1_4*k2_6*k3_5 + k1_5*k2_4*k3_6 - k1_5*k2_6*k3_4 - k1_6*k2_4*k3_5 + k1_6*k2_5*k3_4)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m6_2 = (-k1_4*k2_5*k3_9 + k1_4*k2_9*k3_5 + k1_5*k2_4*k3_9 - k1_5*k2_9*k3_4 - k1_9*k2_4*k3_5 + k1_9*k2_5*k3_4)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m7_0, m7_1;
	m7_0 = (-k1_2*k2_3*k3_5 + k1_2*k2_5*k3_3 + k1_3*k2_2*k3_5 - k1_3*k2_5*k3_2 - k1_5*k2_2*k3_3 + k1_5*k2_3*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m7_1 = (k1_2*k2_5*k3_8 - k1_2*k2_8*k3_5 - k1_5*k2_2*k3_8 + k1_5*k2_8*k3_2 + k1_8*k2_2*k3_5 - k1_8*k2_5*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m8_0, m8_1;
	m8_0 = (k1_1*k2_2*k3_5 - k1_1*k2_5*k3_2 - k1_2*k2_1*k3_5 + k1_2*k2_5*k3_1 + k1_5*k2_1*k3_2 - k1_5*k2_2*k3_1)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m8_1 = (k1_2*k2_5*k3_7 - k1_2*k2_7*k3_5 - k1_5*k2_2*k3_7 + k1_5*k2_7*k3_2 + k1_7*k2_2*k3_5 - k1_7*k2_5*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m9_0, m9_1, m9_2;
	m9_0 = (k1_0*k2_2*k3_5 - k1_0*k2_5*k3_2 - k1_2*k2_0*k3_5 + k1_2*k2_5*k3_0 + k1_5*k2_0*k3_2 - k1_5*k2_2*k3_0)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m9_1 = (k1_2*k2_5*k3_6 - k1_2*k2_6*k3_5 - k1_5*k2_2*k3_6 + k1_5*k2_6*k3_2 + k1_6*k2_2*k3_5 - k1_6*k2_5*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m9_2 = (k1_2*k2_5*k3_9 - k1_2*k2_9*k3_5 - k1_5*k2_2*k3_9 + k1_5*k2_9*k3_2 + k1_9*k2_2*k3_5 - k1_9*k2_5*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec n1_0, n1_1, n1_2;
	n1_0 = m2_0*m4_0 - m7_0*m8_0 - m9_0;
	n1_1 = m2_0*m4_1 + m2_1*m4_0 - m7_0*m8_1 - m7_1*m8_0 - m9_1;
	n1_2 = m2_1*m4_1 - m7_1*m8_1 - m9_2;

	floatPrec n2_0, n2_1, n2_2;
	n2_0 = m1_0*m8_0 + m2_0*m5_0 - m2_0*m7_0 + m3_0 - m8_0*m8_0;
	n2_1 = m1_0*m8_1 + m1_1*m8_0 + m2_0*m5_1 - m2_0*m7_1 + m2_1*m5_0 - m2_1*m7_0 + m3_1 - 2*m8_0*m8_1;
	n2_2 = m1_1*m8_1 + m2_1*m5_1 - m2_1*m7_1 + m3_2 - m8_1*m8_1;

	floatPrec n3_0, n3_1, n3_2, n3_3;
	n3_0 = m1_0*m9_0 + m2_0*m6_0 - m3_0*m7_0 - m8_0*m9_0;
	n3_1 = m1_0*m9_1 + m1_1*m9_0 + m2_0*m6_1 + m2_1*m6_0 - m3_0*m7_1 - m3_1*m7_0 - m8_0*m9_1 - m8_1*m9_0;
	n3_2 = m1_0*m9_2 + m1_1*m9_1 + m2_0*m6_2 + m2_1*m6_1 - m3_1*m7_1 - m3_2*m7_0 - m8_0*m9_2 - m8_1*m9_1;
	n3_3 = m1_1*m9_2 + m2_1*m6_2 - m3_2*m7_1 - m8_1*m9_2;

	floatPrec n4_0, n4_1, n4_2;
	n4_0 = -m1_0*m4_0 + m4_0*m8_0 - m5_0*m7_0 - m6_0 + m7_0*m7_0;
	n4_1 = -m1_0*m4_1 - m1_1*m4_0 + m4_0*m8_1 + m4_1*m8_0 - m5_0*m7_1 - m5_1*m7_0 - m6_1 + 2*m7_0*m7_1;
	n4_2 = -m1_1*m4_1 + m4_1*m8_1 - m5_1*m7_1 - m6_2 + m7_1*m7_1;

	floatPrec n5_0, n5_1, n5_2;
	n5_0 = -m2_0*m4_0 + m7_0*m8_0 + m9_0;
	n5_1 = -m2_0*m4_1 - m2_1*m4_0 + m7_0*m8_1 + m7_1*m8_0 + m9_1;
	n5_2 = -m2_1*m4_1 + m7_1*m8_1 + m9_2;

	floatPrec n6_0, n6_1, n6_2, n6_3;
	n6_0 = -m3_0*m4_0 - m5_0*m9_0 + m6_0*m8_0 + m7_0*m9_0;
	n6_1 = -m3_0*m4_1 - m3_1*m4_0 - m5_0*m9_1 - m5_1*m9_0 + m6_0*m8_1 + m6_1*m8_0 + m7_0*m9_1 + m7_1*m9_0;
	n6_2 = -m3_1*m4_1 - m3_2*m4_0 - m5_0*m9_2 - m5_1*m9_1 + m6_1*m8_1 + m6_2*m8_0 + m7_0*m9_2 + m7_1*m9_1;
	n6_3 = -m3_2*m4_1 - m5_1*m9_2 + m6_2*m8_1 + m7_1*m9_2;

	floatPrec n7_0, n7_1, n7_2, n7_3;
	n7_0 = -m1_0*m1_0*m4_0 - m1_0*m5_0*m7_0 - m1_0*m6_0 + m1_0*m7_0*m7_0 - m2_0*m4_0*m5_0 - m2_0*m4_0*m7_0 - m3_0*m4_0 + m4_0*m8_0*m8_0 + 2*m7_0*m7_0*m8_0 + 2*m7_0*m9_0;
	n7_1 = -m1_0*m1_0*m4_1 - 2*m1_0*m1_1*m4_0 - m1_0*m5_0*m7_1 - m1_0*m5_1*m7_0 - m1_0*m6_1 + 2*m1_0*m7_0*m7_1 - m1_1*m5_0*m7_0 - m1_1*m6_0 + m1_1*m7_0*m7_0 - m2_0*m4_0*m5_1 - m2_0*m4_0*m7_1 - m2_0*m4_1*m5_0 - m2_0*m4_1*m7_0 - m2_1*m4_0*m5_0 - m2_1*m4_0*m7_0 - m3_0*m4_1 - m3_1*m4_0 + 2*m4_0*m8_0*m8_1 + m4_1*m8_0*m8_0 + 2*m7_0*m7_0*m8_1 + 4*m7_0*m7_1*m8_0 + 2*m7_0*m9_1 + 2*m7_1*m9_0;
	n7_2 = -2*m1_0*m1_1*m4_1 - m1_0*m5_1*m7_1 - m1_0*m6_2 + m1_0*m7_1*m7_1 - m1_1*m1_1*m4_0 - m1_1*m5_0*m7_1 - m1_1*m5_1*m7_0 - m1_1*m6_1 + 2*m1_1*m7_0*m7_1 - m2_0*m4_1*m5_1 - m2_0*m4_1*m7_1 - m2_1*m4_0*m5_1 - m2_1*m4_0*m7_1 - m2_1*m4_1*m5_0 - m2_1*m4_1*m7_0 - m3_1*m4_1 - m3_2*m4_0 + m4_0*m8_1*m8_1 + 2*m4_1*m8_0*m8_1 + 4*m7_0*m7_1*m8_1 + 2*m7_0*m9_2 + 2*m7_1*m7_1*m8_0 + 2*m7_1*m9_1;
	n7_3 = -m1_1*m1_1*m4_1 - m1_1*m5_1*m7_1 - m1_1*m6_2 + m1_1*m7_1*m7_1 - m2_1*m4_1*m5_1 - m2_1*m4_1*m7_1 - m3_2*m4_1 + m4_1*m8_1*m8_1 + 2*m7_1*m7_1*m8_1 + 2*m7_1*m9_2;

	floatPrec n8_0, n8_1, n8_2, n8_3;
	n8_0 = -m1_0*m2_0*m4_0 - m1_0*m5_0*m8_0 - m2_0*m4_0*m8_0 - m2_0*m5_0*m5_0 - m2_0*m6_0 + m2_0*m7_0*m7_0 - m3_0*m5_0 + m5_0*m8_0*m8_0 + 2*m7_0*m8_0*m8_0 + 2*m8_0*m9_0;
	n8_1 = -m1_0*m2_0*m4_1 - m1_0*m2_1*m4_0 - m1_0*m5_0*m8_1 - m1_0*m5_1*m8_0 - m1_1*m2_0*m4_0 - m1_1*m5_0*m8_0 - m2_0*m4_0*m8_1 - m2_0*m4_1*m8_0 - 2*m2_0*m5_0*m5_1 - m2_0*m6_1 + 2*m2_0*m7_0*m7_1 - m2_1*m4_0*m8_0 - m2_1*m5_0*m5_0 - m2_1*m6_0 + m2_1*m7_0*m7_0 - m3_0*m5_1 - m3_1*m5_0 + 2*m5_0*m8_0*m8_1 + m5_1*m8_0*m8_0 + 4*m7_0*m8_0*m8_1 + 2*m7_1*m8_0*m8_0 + 2*m8_0*m9_1 + 2*m8_1*m9_0;
	n8_2 = -m1_0*m2_1*m4_1 - m1_0*m5_1*m8_1 - m1_1*m2_0*m4_1 - m1_1*m2_1*m4_0 - m1_1*m5_0*m8_1 - m1_1*m5_1*m8_0 - m2_0*m4_1*m8_1 - m2_0*m5_1*m5_1 - m2_0*m6_2 + m2_0*m7_1*m7_1 - m2_1*m4_0*m8_1 - m2_1*m4_1*m8_0 - 2*m2_1*m5_0*m5_1 - m2_1*m6_1 + 2*m2_1*m7_0*m7_1 - m3_1*m5_1 - m3_2*m5_0 + m5_0*m8_1*m8_1 + 2*m5_1*m8_0*m8_1 + 2*m7_0*m8_1*m8_1 + 4*m7_1*m8_0*m8_1 + 2*m8_0*m9_2 + 2*m8_1*m9_1;
	n8_3 = -m1_1*m2_1*m4_1 - m1_1*m5_1*m8_1 - m2_1*m4_1*m8_1 - m2_1*m5_1*m5_1 - m2_1*m6_2 + m2_1*m7_1*m7_1 - m3_2*m5_1 + m5_1*m8_1*m8_1 + 2*m7_1*m8_1*m8_1 + 2*m8_1*m9_2;

	floatPrec n9_0, n9_1, n9_2, n9_3, n9_4;
	n9_0 = -m1_0*m3_0*m4_0 - m1_0*m5_0*m9_0 - m2_0*m4_0*m9_0 - m2_0*m5_0*m6_0 - m3_0*m6_0 + m3_0*m7_0*m7_0 + m6_0*m8_0*m8_0 + 2*m7_0*m8_0*m9_0 + m9_0*m9_0;
	n9_1 = -m1_0*m3_0*m4_1 - m1_0*m3_1*m4_0 - m1_0*m5_0*m9_1 - m1_0*m5_1*m9_0 - m1_1*m3_0*m4_0 - m1_1*m5_0*m9_0 - m2_0*m4_0*m9_1 - m2_0*m4_1*m9_0 - m2_0*m5_0*m6_1 - m2_0*m5_1*m6_0 - m2_1*m4_0*m9_0 - m2_1*m5_0*m6_0 - m3_0*m6_1 + 2*m3_0*m7_0*m7_1 - m3_1*m6_0 + m3_1*m7_0*m7_0 + 2*m6_0*m8_0*m8_1 + m6_1*m8_0*m8_0 + 2*m7_0*m8_0*m9_1 + 2*m7_0*m8_1*m9_0 + 2*m7_1*m8_0*m9_0 + 2*m9_0*m9_1;
	n9_2 = -m1_0*m3_1*m4_1 - m1_0*m3_2*m4_0 - m1_0*m5_0*m9_2 - m1_0*m5_1*m9_1 - m1_1*m3_0*m4_1 - m1_1*m3_1*m4_0 - m1_1*m5_0*m9_1 - m1_1*m5_1*m9_0 - m2_0*m4_0*m9_2 - m2_0*m4_1*m9_1 - m2_0*m5_0*m6_2 - m2_0*m5_1*m6_1 - m2_1*m4_0*m9_1 - m2_1*m4_1*m9_0 - m2_1*m5_0*m6_1 - m2_1*m5_1*m6_0 - m3_0*m6_2 + m3_0*m7_1*m7_1 - m3_1*m6_1 + 2*m3_1*m7_0*m7_1 - m3_2*m6_0 + m3_2*m7_0*m7_0 + m6_0*m8_1*m8_1 + 2*m6_1*m8_0*m8_1 + m6_2*m8_0*m8_0 + 2*m7_0*m8_0*m9_2 + 2*m7_0*m8_1*m9_1 + 2*m7_1*m8_0*m9_1 + 2*m7_1*m8_1*m9_0 + 2*m9_0*m9_2 + m9_1*m9_1;
	n9_3 = -m1_0*m3_2*m4_1 - m1_0*m5_1*m9_2 - m1_1*m3_1*m4_1 - m1_1*m3_2*m4_0 - m1_1*m5_0*m9_2 - m1_1*m5_1*m9_1 - m2_0*m4_1*m9_2 - m2_0*m5_1*m6_2 - m2_1*m4_0*m9_2 - m2_1*m4_1*m9_1 - m2_1*m5_0*m6_2 - m2_1*m5_1*m6_1 - m3_1*m6_2 + m3_1*m7_1*m7_1 - m3_2*m6_1 + 2*m3_2*m7_0*m7_1 + m6_1*m8_1*m8_1 + 2*m6_2*m8_0*m8_1 + 2*m7_0*m8_1*m9_2 + 2*m7_1*m8_0*m9_2 + 2*m7_1*m8_1*m9_1 + 2*m9_1*m9_2;
	n9_4 = -m1_1*m3_2*m4_1 - m1_1*m5_1*m9_2 - m2_1*m4_1*m9_2 - m2_1*m5_1*m6_2 - m3_2*m6_2 + m3_2*m7_1*m7_1 + m6_2*m8_1*m8_1 + 2*m7_1*m8_1*m9_2 + m9_2*m9_2;

	floatPrec o7_0, o7_1, o7_2, o7_3, o7_4, o7_5, o7_6, o7_7, o7_8;
	o7_0 = n1_0*n5_0*n9_0 - n1_0*n6_0*n8_0 - n2_0*n4_0*n9_0 + n2_0*n6_0*n7_0 + n3_0*n4_0*n8_0 - n3_0*n5_0*n7_0;
	o7_1 = n1_0*n5_0*n9_1 + n1_0*n5_1*n9_0 - n1_0*n6_0*n8_1 - n1_0*n6_1*n8_0 + n1_1*n5_0*n9_0 - n1_1*n6_0*n8_0 - n2_0*n4_0*n9_1 - n2_0*n4_1*n9_0 + n2_0*n6_0*n7_1 + n2_0*n6_1*n7_0 - n2_1*n4_0*n9_0 + n2_1*n6_0*n7_0 + n3_0*n4_0*n8_1 + n3_0*n4_1*n8_0 - n3_0*n5_0*n7_1 - n3_0*n5_1*n7_0 + n3_1*n4_0*n8_0 - n3_1*n5_0*n7_0;
	o7_2 = n1_0*n5_0*n9_2 + n1_0*n5_1*n9_1 + n1_0*n5_2*n9_0 - n1_0*n6_0*n8_2 - n1_0*n6_1*n8_1 - n1_0*n6_2*n8_0 + n1_1*n5_0*n9_1 + n1_1*n5_1*n9_0 - n1_1*n6_0*n8_1 - n1_1*n6_1*n8_0 + n1_2*n5_0*n9_0 - n1_2*n6_0*n8_0 - n2_0*n4_0*n9_2 - n2_0*n4_1*n9_1 - n2_0*n4_2*n9_0 + n2_0*n6_0*n7_2 + n2_0*n6_1*n7_1 + n2_0*n6_2*n7_0 - n2_1*n4_0*n9_1 - n2_1*n4_1*n9_0 + n2_1*n6_0*n7_1 + n2_1*n6_1*n7_0 - n2_2*n4_0*n9_0 + n2_2*n6_0*n7_0 + n3_0*n4_0*n8_2 + n3_0*n4_1*n8_1 + n3_0*n4_2*n8_0 - n3_0*n5_0*n7_2 - n3_0*n5_1*n7_1 - n3_0*n5_2*n7_0 + n3_1*n4_0*n8_1 + n3_1*n4_1*n8_0 - n3_1*n5_0*n7_1 - n3_1*n5_1*n7_0 + n3_2*n4_0*n8_0 - n3_2*n5_0*n7_0;
	o7_3 = n1_0*n5_0*n9_3 + n1_0*n5_1*n9_2 + n1_0*n5_2*n9_1 - n1_0*n6_0*n8_3 - n1_0*n6_1*n8_2 - n1_0*n6_2*n8_1 - n1_0*n6_3*n8_0 + n1_1*n5_0*n9_2 + n1_1*n5_1*n9_1 + n1_1*n5_2*n9_0 - n1_1*n6_0*n8_2 - n1_1*n6_1*n8_1 - n1_1*n6_2*n8_0 + n1_2*n5_0*n9_1 + n1_2*n5_1*n9_0 - n1_2*n6_0*n8_1 - n1_2*n6_1*n8_0 - n2_0*n4_0*n9_3 - n2_0*n4_1*n9_2 - n2_0*n4_2*n9_1 + n2_0*n6_0*n7_3 + n2_0*n6_1*n7_2 + n2_0*n6_2*n7_1 + n2_0*n6_3*n7_0 - n2_1*n4_0*n9_2 - n2_1*n4_1*n9_1 - n2_1*n4_2*n9_0 + n2_1*n6_0*n7_2 + n2_1*n6_1*n7_1 + n2_1*n6_2*n7_0 - n2_2*n4_0*n9_1 - n2_2*n4_1*n9_0 + n2_2*n6_0*n7_1 + n2_2*n6_1*n7_0 + n3_0*n4_0*n8_3 + n3_0*n4_1*n8_2 + n3_0*n4_2*n8_1 - n3_0*n5_0*n7_3 - n3_0*n5_1*n7_2 - n3_0*n5_2*n7_1 + n3_1*n4_0*n8_2 + n3_1*n4_1*n8_1 + n3_1*n4_2*n8_0 - n3_1*n5_0*n7_2 - n3_1*n5_1*n7_1 - n3_1*n5_2*n7_0 + n3_2*n4_0*n8_1 + n3_2*n4_1*n8_0 - n3_2*n5_0*n7_1 - n3_2*n5_1*n7_0 + n3_3*n4_0*n8_0 - n3_3*n5_0*n7_0;
	o7_4 = n1_0*n5_0*n9_4 + n1_0*n5_1*n9_3 + n1_0*n5_2*n9_2 - n1_0*n6_1*n8_3 - n1_0*n6_2*n8_2 - n1_0*n6_3*n8_1 + n1_1*n5_0*n9_3 + n1_1*n5_1*n9_2 + n1_1*n5_2*n9_1 - n1_1*n6_0*n8_3 - n1_1*n6_1*n8_2 - n1_1*n6_2*n8_1 - n1_1*n6_3*n8_0 + n1_2*n5_0*n9_2 + n1_2*n5_1*n9_1 + n1_2*n5_2*n9_0 - n1_2*n6_0*n8_2 - n1_2*n6_1*n8_1 - n1_2*n6_2*n8_0 - n2_0*n4_0*n9_4 - n2_0*n4_1*n9_3 - n2_0*n4_2*n9_2 + n2_0*n6_1*n7_3 + n2_0*n6_2*n7_2 + n2_0*n6_3*n7_1 - n2_1*n4_0*n9_3 - n2_1*n4_1*n9_2 - n2_1*n4_2*n9_1 + n2_1*n6_0*n7_3 + n2_1*n6_1*n7_2 + n2_1*n6_2*n7_1 + n2_1*n6_3*n7_0 - n2_2*n4_0*n9_2 - n2_2*n4_1*n9_1 - n2_2*n4_2*n9_0 + n2_2*n6_0*n7_2 + n2_2*n6_1*n7_1 + n2_2*n6_2*n7_0 + n3_0*n4_1*n8_3 + n3_0*n4_2*n8_2 - n3_0*n5_1*n7_3 - n3_0*n5_2*n7_2 + n3_1*n4_0*n8_3 + n3_1*n4_1*n8_2 + n3_1*n4_2*n8_1 - n3_1*n5_0*n7_3 - n3_1*n5_1*n7_2 - n3_1*n5_2*n7_1 + n3_2*n4_0*n8_2 + n3_2*n4_1*n8_1 + n3_2*n4_2*n8_0 - n3_2*n5_0*n7_2 - n3_2*n5_1*n7_1 - n3_2*n5_2*n7_0 + n3_3*n4_0*n8_1 + n3_3*n4_1*n8_0 - n3_3*n5_0*n7_1 - n3_3*n5_1*n7_0;
	o7_5 = n1_0*n5_1*n9_4 + n1_0*n5_2*n9_3 - n1_0*n6_2*n8_3 - n1_0*n6_3*n8_2 + n1_1*n5_0*n9_4 + n1_1*n5_1*n9_3 + n1_1*n5_2*n9_2 - n1_1*n6_1*n8_3 - n1_1*n6_2*n8_2 - n1_1*n6_3*n8_1 + n1_2*n5_0*n9_3 + n1_2*n5_1*n9_2 + n1_2*n5_2*n9_1 - n1_2*n6_0*n8_3 - n1_2*n6_1*n8_2 - n1_2*n6_2*n8_1 - n1_2*n6_3*n8_0 - n2_0*n4_1*n9_4 - n2_0*n4_2*n9_3 + n2_0*n6_2*n7_3 + n2_0*n6_3*n7_2 - n2_1*n4_0*n9_4 - n2_1*n4_1*n9_3 - n2_1*n4_2*n9_2 + n2_1*n6_1*n7_3 + n2_1*n6_2*n7_2 + n2_1*n6_3*n7_1 - n2_2*n4_0*n9_3 - n2_2*n4_1*n9_2 - n2_2*n4_2*n9_1 + n2_2*n6_0*n7_3 + n2_2*n6_1*n7_2 + n2_2*n6_2*n7_1 + n2_2*n6_3*n7_0 + n3_0*n4_2*n8_3 - n3_0*n5_2*n7_3 + n3_1*n4_1*n8_3 + n3_1*n4_2*n8_2 - n3_1*n5_1*n7_3 - n3_1*n5_2*n7_2 + n3_2*n4_0*n8_3 + n3_2*n4_1*n8_2 + n3_2*n4_2*n8_1 - n3_2*n5_0*n7_3 - n3_2*n5_1*n7_2 - n3_2*n5_2*n7_1 + n3_3*n4_0*n8_2 + n3_3*n4_1*n8_1 + n3_3*n4_2*n8_0 - n3_3*n5_0*n7_2 - n3_3*n5_1*n7_1 - n3_3*n5_2*n7_0;
	o7_6 = n1_0*n5_2*n9_4 - n1_0*n6_3*n8_3 + n1_1*n5_1*n9_4 + n1_1*n5_2*n9_3 - n1_1*n6_2*n8_3 - n1_1*n6_3*n8_2 + n1_2*n5_0*n9_4 + n1_2*n5_1*n9_3 + n1_2*n5_2*n9_2 - n1_2*n6_1*n8_3 - n1_2*n6_2*n8_2 - n1_2*n6_3*n8_1 - n2_0*n4_2*n9_4 + n2_0*n6_3*n7_3 - n2_1*n4_1*n9_4 - n2_1*n4_2*n9_3 + n2_1*n6_2*n7_3 + n2_1*n6_3*n7_2 - n2_2*n4_0*n9_4 - n2_2*n4_1*n9_3 - n2_2*n4_2*n9_2 + n2_2*n6_1*n7_3 + n2_2*n6_2*n7_2 + n2_2*n6_3*n7_1 + n3_1*n4_2*n8_3 - n3_1*n5_2*n7_3 + n3_2*n4_1*n8_3 + n3_2*n4_2*n8_2 - n3_2*n5_1*n7_3 - n3_2*n5_2*n7_2 + n3_3*n4_0*n8_3 + n3_3*n4_1*n8_2 + n3_3*n4_2*n8_1 - n3_3*n5_0*n7_3 - n3_3*n5_1*n7_2 - n3_3*n5_2*n7_1;
	o7_7 = n1_1*n5_2*n9_4 - n1_1*n6_3*n8_3 + n1_2*n5_1*n9_4 + n1_2*n5_2*n9_3 - n1_2*n6_2*n8_3 - n1_2*n6_3*n8_2 - n2_1*n4_2*n9_4 + n2_1*n6_3*n7_3 - n2_2*n4_1*n9_4 - n2_2*n4_2*n9_3 + n2_2*n6_2*n7_3 + n2_2*n6_3*n7_2 + n3_2*n4_2*n8_3 - n3_2*n5_2*n7_3 + n3_3*n4_1*n8_3 + n3_3*n4_2*n8_2 - n3_3*n5_1*n7_3 - n3_3*n5_2*n7_2;
	o7_8 = n1_2*n5_2*n9_4 - n1_2*n6_3*n8_3 - n2_2*n4_2*n9_4 + n2_2*n6_3*n7_3 + n3_3*n4_2*n8_3 - n3_3*n5_2*n7_3;

	Eigen::Matrix<floatPrec,9,1> coeff(9);
	coeff[0] = o7_0;
	coeff[1] = o7_1;
	coeff[2] = o7_2;
	coeff[3] = o7_3;
	coeff[4] = o7_4;
	coeff[5] = o7_5;
	coeff[6] = o7_6;
	coeff[7] = o7_7;
	coeff[8] = o7_8;

	std::vector<floatPrec> calc_realRoots;
	Eigen::PolynomialSolver<floatPrec, Eigen::Dynamic> solver;
    unsigned int numHyp = 0;
	if(coeff[coeff.size()-1] != floatPrec(0.0)){
		// std::cout << coeff.transpose() << std::endl;
		solver.compute(coeff);
		solver.realRoots(calc_realRoots);    
		numHyp = calc_realRoots.size();
	}
	else{
		return out;
	}

	floatPrec x, y, z;
	floatPrec r11, r12, r13, r21, r22, r23, r31, r32, r33, r_;

	Matrix<floatPrec, 4,4> TP;
	for(unsigned int i = 0; i < numHyp; i++){

		TP.setIdentity(4,4);

		x = calc_realRoots[i];
		y = (n2_0*n6_0 + n2_0*n6_1*x + n2_0*n6_2*x*x + n2_0*n6_3*x*x*x + n2_1*n6_0*x + n2_1*n6_1*x*x + n2_1*n6_2*x*x*x + n2_1*n6_3*x*x*x*x + n2_2*n6_0*x*x + n2_2*n6_1*x*x*x + n2_2*n6_2*x*x*x*x + n2_2*n6_3*x*x*x*x*x - n3_0*n5_0 - n3_0*n5_1*x - n3_0*n5_2*x*x - n3_1*n5_0*x - n3_1*n5_1*x*x - n3_1*n5_2*x*x*x - n3_2*n5_0*x*x - n3_2*n5_1*x*x*x - n3_2*n5_2*x*x*x*x - n3_3*n5_0*x*x*x - n3_3*n5_1*x*x*x*x - n3_3*n5_2*x*x*x*x*x)/(n1_0*n5_0 + n1_0*n5_1*x + n1_0*n5_2*x*x + n1_1*n5_0*x + n1_1*n5_1*x*x + n1_1*n5_2*x*x*x + n1_2*n5_0*x*x + n1_2*n5_1*x*x*x + n1_2*n5_2*x*x*x*x - n2_0*n4_0 - n2_0*n4_1*x - n2_0*n4_2*x*x - n2_1*n4_0*x - n2_1*n4_1*x*x - n2_1*n4_2*x*x*x - n2_2*n4_0*x*x - n2_2*n4_1*x*x*x - n2_2*n4_2*x*x*x*x);
		z = (-n1_0*n6_0 - n1_0*n6_1*x - n1_0*n6_2*x*x - n1_0*n6_3*x*x*x - n1_1*n6_0*x - n1_1*n6_1*x*x - n1_1*n6_2*x*x*x - n1_1*n6_3*x*x*x*x - n1_2*n6_0*x*x - n1_2*n6_1*x*x*x - n1_2*n6_2*x*x*x*x - n1_2*n6_3*x*x*x*x*x + n3_0*n4_0 + n3_0*n4_1*x + n3_0*n4_2*x*x + n3_1*n4_0*x + n3_1*n4_1*x*x + n3_1*n4_2*x*x*x + n3_2*n4_0*x*x + n3_2*n4_1*x*x*x + n3_2*n4_2*x*x*x*x + n3_3*n4_0*x*x*x + n3_3*n4_1*x*x*x*x + n3_3*n4_2*x*x*x*x*x)/(n1_0*n5_0 + n1_0*n5_1*x + n1_0*n5_2*x*x + n1_1*n5_0*x + n1_1*n5_1*x*x + n1_1*n5_2*x*x*x + n1_2*n5_0*x*x + n1_2*n5_1*x*x*x + n1_2*n5_2*x*x*x*x - n2_0*n4_0 - n2_0*n4_1*x - n2_0*n4_2*x*x - n2_1*n4_0*x - n2_1*n4_1*x*x - n2_1*n4_2*x*x*x - n2_2*n4_0*x*x - n2_2*n4_1*x*x*x - n2_2*n4_2*x*x*x*x);

		r_  = 1 + x*x + y*y + z*z;
		r11 = 1 + x*x - y*y - z*z; r11 /= r_;
		r12 = 2*x*y - 2*z; r12 /= r_;
		r13 = 2*y + 2*x*z; r13 /= r_;
		r21 = 2*x*y + 2*z; r21 /= r_;
		r22 = 1 - x*x + y*y - z*z; r22 /= r_;
		r23 = 2*y*z - 2*x; r23 /= r_;
		r31 = 2*x*z - 2*y; r31 /= r_;
		r32 = 2*x + 2*y*z;  r32 /= r_;
		r33 = 1 - x*x - y*y + z*z; r33 /= r_;

		TP.topLeftCorner(3, 3) << r11, r12, r13, r21, r22, r23, r31, r32, r33;
		Matrix<floatPrec, 4,4> outi = TV.inverse() * TP * TU;

		out.push_back(outi);

	}

	return out;
}